

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

int Ses_ManFindNetworkExact(Ses_Man_t *pSes,int nGates)

{
  lit *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  sat_solver *psVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  size_t __size;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar52;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar53;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint uVar54;
  int iVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  int iVar72;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar71;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar73;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint uVar86;
  int iVar87;
  timespec ts;
  timespec local_80;
  ulong local_70;
  Vec_Int_t *local_68;
  ulong local_60;
  uint local_54;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  iVar3 = clock_gettime(3,&local_80);
  if (iVar3 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec)),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) +
            CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * -1000000;
  }
  iVar3 = 0;
  pSes->vPolar->nSize = 0;
  pSes->vAssump->nSize = 0;
  if (pSes->fSatVerbose != 0) {
    printf("create variables for network with %d functions over %d variables and %d/%d gates\n",
           (ulong)(uint)pSes->nSpecFunc,(ulong)(uint)pSes->nSpecVars,(ulong)(uint)nGates,
           (ulong)(uint)pSes->nMaxGates);
  }
  pSes->nGates = nGates;
  pSes->nSimVars = pSes->nRows * nGates;
  iVar4 = pSes->nSpecFunc * nGates;
  pSes->nOutputVars = iVar4;
  pSes->nGateVars = nGates * 3;
  pSes->nSelectVars = 0;
  if (0 < nGates) {
    iVar3 = pSes->nSpecVars;
    iVar13 = iVar3 + 1;
    if (iVar3 + 1 < iVar3 + nGates) {
      iVar13 = iVar3 + nGates;
    }
    iVar13 = iVar13 - iVar3;
    uVar14 = iVar13 - 1;
    iVar67 = iVar3 + 1;
    uVar69 = iVar3 + 2;
    iVar72 = iVar3 + 3;
    iVar12 = 4;
    uVar73 = 0;
    uVar76 = 0;
    uVar79 = 0;
    uVar86 = 0;
    do {
      uVar52 = uVar86;
      uVar82 = uVar79;
      uVar80 = uVar76;
      uVar53 = uVar73;
      auVar74._0_4_ = iVar3 + -1;
      auVar74._4_4_ = iVar67 + -1;
      auVar74._8_4_ = uVar69 - 1;
      auVar74._12_4_ = iVar72 - 1;
      auVar75._4_4_ = iVar67;
      auVar75._0_4_ = iVar67;
      auVar75._8_4_ = iVar72;
      auVar75._12_4_ = iVar72;
      uVar73 = (auVar74._0_4_ * iVar3) / 2 + uVar53;
      uVar76 = (iVar67 * auVar74._4_4_) / 2 + uVar80;
      uVar79 = (int)((auVar74._8_8_ & 0xffffffff) * (ulong)uVar69) / 2 + uVar82;
      uVar86 = (int)((auVar75._8_8_ & 0xffffffff) * (ulong)auVar74._12_4_) / 2 + uVar52;
      iVar3 = iVar3 + 4;
      iVar67 = iVar67 + 4;
      uVar69 = uVar69 + 4;
      iVar72 = iVar72 + 4;
      iVar11 = iVar12 + -4;
      iVar15 = iVar12 + (iVar13 + 3U & 0xfffffffc);
      iVar12 = iVar11;
    } while (iVar15 != 8);
    uVar69 = -iVar11;
    uVar54 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar69 ^ 0x80000000));
    uVar68 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)((uVar69 | 1) ^ 0x80000000));
    uVar70 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)((uVar69 | 2) ^ 0x80000000));
    uVar14 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)((uVar69 | 3) ^ 0x80000000));
    iVar3 = (~uVar14 & uVar86 | uVar52 & uVar14) + (~uVar68 & uVar76 | uVar80 & uVar68) +
            (~uVar70 & uVar79 | uVar82 & uVar70) + (~uVar54 & uVar73 | uVar53 & uVar54);
    pSes->nSelectVars = iVar3;
  }
  if (pSes->nMaxDepth < 1) {
    iVar13 = 0;
  }
  else {
    iVar13 = ((nGates + 1) * nGates) / 2 + pSes->nArrTimeMax * nGates;
  }
  pSes->nDepthVars = iVar13;
  pSes->nDepthOffset = 0;
  pSes->nSelectOffset = iVar13;
  pSes->nGateOffset = iVar3 + iVar13;
  iVar3 = iVar3 + iVar13 + nGates * 3;
  pSes->nOutputOffset = iVar3;
  pSes->nSimOffset = iVar3 + iVar4;
  if (pSes->pSat == (sat_solver *)0x0) {
    psVar5 = sat_solver_new();
    pSes->pSat = psVar5;
  }
  else {
    sat_solver_restart(pSes->pSat);
    psVar5 = pSes->pSat;
  }
  sat_solver_setnvars(psVar5,pSes->nSelectVars + pSes->nOutputVars +
                             pSes->nGateVars + pSes->nSimVars + pSes->nDepthVars);
  if (pSes->nMaxDepth != -1) {
    uVar19 = 0;
    if (0 < pSes->nGates) {
      uVar73 = 2;
      uVar76 = 0;
      local_48 = lVar9;
      do {
        local_38 = uVar19 >> 1;
        local_54 = uVar73;
        local_40 = uVar19;
        if (uVar76 < 2) {
          iVar3 = 1;
          if (uVar76 != 0) goto LAB_002bf9be;
          bVar2 = true;
        }
        else {
          iVar3 = (int)local_38;
          local_50 = (ulong)((uVar76 + 1) * uVar76 >> 1);
          uVar19 = 1;
          do {
            iVar4 = 2;
            uVar21 = 0;
            iVar13 = 0;
            local_60 = uVar19;
            do {
              if (pSes->nGates <= (int)uVar76) goto LAB_002c24db;
              local_68 = (Vec_Int_t *)CONCAT44(local_68._4_4_,iVar4);
              iVar4 = pSes->nSpecVars;
              uVar73 = iVar4 + iVar13;
              iVar67 = iVar4 + uVar76;
              iVar12 = iVar4 + 1;
              if (iVar4 + 1 < iVar67) {
                iVar12 = iVar67;
              }
              iVar11 = iVar4 + (int)local_60;
              iVar12 = iVar12 - iVar4;
              uVar79 = iVar12 - 1;
              iVar15 = iVar4 + 1;
              uVar80 = iVar4 + 2;
              iVar87 = iVar4 + 3;
              iVar72 = 4;
              uVar86 = pSes->nSelectOffset;
              uVar14 = 0;
              uVar69 = 0;
              uVar53 = 0;
              do {
                uVar68 = uVar53;
                uVar54 = uVar69;
                uVar52 = uVar14;
                uVar82 = uVar86;
                auVar22._0_4_ = iVar4 + -1;
                auVar22._4_4_ = iVar15 + -1;
                auVar22._8_4_ = uVar80 - 1;
                auVar22._12_4_ = iVar87 - 1;
                auVar23._4_4_ = iVar15;
                auVar23._0_4_ = iVar15;
                auVar23._8_4_ = iVar87;
                auVar23._12_4_ = iVar87;
                uVar86 = (auVar22._0_4_ * iVar4) / 2 + uVar82;
                uVar14 = (iVar15 * auVar22._4_4_) / 2 + uVar52;
                uVar69 = (int)((auVar22._8_8_ & 0xffffffff) * (ulong)uVar80) / 2 + uVar54;
                uVar53 = (int)((auVar23._8_8_ & 0xffffffff) * (ulong)auVar22._12_4_) / 2 + uVar68;
                iVar4 = iVar4 + 4;
                iVar15 = iVar15 + 4;
                uVar80 = uVar80 + 4;
                iVar87 = iVar87 + 4;
                iVar16 = iVar72 + -4;
                iVar17 = iVar72 + (iVar12 + 3U & 0xfffffffc);
                iVar72 = iVar16;
              } while (iVar17 != 8);
              uVar80 = -iVar16;
              uVar70 = -(uint)((int)(uVar79 ^ 0x80000000) < (int)(uVar80 ^ 0x80000000));
              uVar77 = -(uint)((int)(uVar79 ^ 0x80000000) < (int)((uVar80 | 1) ^ 0x80000000));
              uVar81 = -(uint)((int)(uVar79 ^ 0x80000000) < (int)((uVar80 | 2) ^ 0x80000000));
              uVar80 = -(uint)((int)(uVar79 ^ 0x80000000) < (int)((uVar80 | 3) ^ 0x80000000));
              uVar79 = ~uVar73;
              iVar4 = iVar11 + uVar79 + (int)((uVar79 + iVar67 * 2) * uVar73) / 2 +
                      (~uVar80 & uVar53 | uVar68 & uVar80) + (~uVar77 & uVar14 | uVar52 & uVar77) +
                      (~uVar81 & uVar69 | uVar54 & uVar81) + (~uVar70 & uVar86 | uVar82 & uVar70);
              if (iVar4 < 0) goto LAB_002c247c;
              local_70 = CONCAT44(local_70._4_4_,(int)uVar21);
              local_80.tv_sec._0_4_ = iVar4 * 2 + 1;
              iVar4 = pSes->nArrTimeMax;
              if (-1 < iVar4 + iVar13) {
                iVar12 = 0;
                do {
                  if (pSes->nGates <= iVar13) goto LAB_002c0244;
                  iVar67 = iVar13 * iVar4 + pSes->nDepthOffset + iVar12 + (int)(uVar21 >> 1);
                  if (iVar67 < 0) goto LAB_002c247c;
                  local_80.tv_sec._4_4_ = iVar67 * 2 + 1;
                  if (pSes->nGates <= (int)uVar76) goto LAB_002c0244;
                  iVar4 = pSes->nDepthOffset + iVar4 * uVar76 + iVar12 + iVar3 + 1;
                  if (iVar4 < 0) goto LAB_002c247c;
                  local_80.tv_nsec._0_4_ = iVar4 * 2;
                  sat_solver_addclause
                            (pSes->pSat,(lit *)&local_80,(lit *)((long)&local_80.tv_nsec + 4));
                  iVar4 = pSes->nArrTimeMax;
                  bVar2 = iVar12 < iVar4 + iVar13;
                  iVar12 = iVar12 + 1;
                } while (bVar2);
              }
              iVar13 = iVar13 + 1;
              uVar21 = (ulong)((uint)local_70 + (uint)local_68);
              iVar4 = (uint)local_68 + 2;
            } while (iVar13 != (int)local_60);
            uVar73 = (int)local_60 + 1;
            uVar19 = (ulong)uVar73;
          } while (uVar73 != uVar76);
          iVar3 = (int)local_50;
LAB_002bf9be:
          iVar4 = pSes->nSpecVars;
          iVar12 = 2;
          uVar19 = 0;
          uVar73 = 0;
          iVar13 = iVar4;
          do {
            local_60 = CONCAT44(local_60._4_4_,iVar12);
            iVar12 = uVar73 + iVar4;
            local_50 = CONCAT44(local_50._4_4_,(int)uVar19);
            if (iVar12 != 0 && SCARRY4(uVar73,iVar4) == iVar12 < 0) {
              iVar67 = -uVar73;
              uVar79 = 0;
              local_70 = CONCAT44(local_70._4_4_,iVar67);
              do {
                if (pSes->nGates <= (int)uVar76) goto LAB_002c24db;
                iVar72 = iVar4 + uVar76;
                iVar11 = iVar4 + 1;
                if (iVar4 + 1 < iVar72) {
                  iVar11 = iVar72;
                }
                iVar11 = iVar11 - iVar4;
                uVar86 = iVar11 - 1;
                iVar87 = iVar4 + 1;
                uVar82 = iVar4 + 2;
                iVar16 = iVar4 + 3;
                iVar15 = 4;
                uVar14 = pSes->nSelectOffset;
                uVar69 = 0;
                uVar53 = 0;
                uVar80 = 0;
                do {
                  uVar70 = uVar80;
                  uVar68 = uVar53;
                  uVar54 = uVar69;
                  uVar52 = uVar14;
                  auVar24._0_4_ = iVar4 + -1;
                  auVar24._4_4_ = iVar87 + -1;
                  auVar24._8_4_ = uVar82 - 1;
                  auVar24._12_4_ = iVar16 - 1;
                  auVar25._4_4_ = iVar87;
                  auVar25._0_4_ = iVar87;
                  auVar25._8_4_ = iVar16;
                  auVar25._12_4_ = iVar16;
                  uVar14 = (auVar24._0_4_ * iVar4) / 2 + uVar52;
                  uVar69 = (iVar87 * auVar24._4_4_) / 2 + uVar54;
                  uVar53 = (int)((auVar24._8_8_ & 0xffffffff) * (ulong)uVar82) / 2 + uVar68;
                  uVar80 = (int)((auVar25._8_8_ & 0xffffffff) * (ulong)auVar24._12_4_) / 2 + uVar70;
                  iVar4 = iVar4 + 4;
                  iVar87 = iVar87 + 4;
                  uVar82 = uVar82 + 4;
                  iVar16 = iVar16 + 4;
                  iVar17 = iVar15 + -4;
                  iVar18 = iVar15 + (iVar11 + 3U & 0xfffffffc);
                  iVar15 = iVar17;
                } while (iVar18 != 8);
                uVar82 = -iVar17;
                uVar77 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)(uVar82 ^ 0x80000000));
                uVar81 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)((uVar82 | 1) ^ 0x80000000));
                uVar83 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)((uVar82 | 2) ^ 0x80000000));
                uVar86 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)((uVar82 | 3) ^ 0x80000000));
                iVar4 = iVar12 + ~uVar79 + (int)((~uVar79 + iVar72 * 2) * uVar79) / 2 +
                        (~uVar86 & uVar80 | uVar70 & uVar86) + (~uVar81 & uVar69 | uVar54 & uVar81)
                        + (~uVar83 & uVar53 | uVar68 & uVar83) +
                          (~uVar77 & uVar14 | uVar52 & uVar77);
                if (iVar4 < 0) goto LAB_002c247c;
                local_80.tv_sec._0_4_ = iVar4 * 2 + 1;
                iVar12 = pSes->nArrTimeMax;
                iVar4 = iVar13;
                if (iVar67 <= iVar12) {
                  local_68 = (Vec_Int_t *)CONCAT44(local_68._4_4_,uVar79);
                  iVar4 = 0;
                  do {
                    if (pSes->nGates <= (int)uVar73) goto LAB_002c0244;
                    iVar13 = uVar73 * iVar12 + pSes->nDepthOffset + (int)(uVar19 >> 1) + iVar4;
                    if (iVar13 < 0) goto LAB_002c247c;
                    local_80.tv_sec._4_4_ = iVar13 * 2 + 1;
                    if (pSes->nGates <= (int)uVar76) goto LAB_002c0244;
                    iVar13 = pSes->nDepthOffset + iVar12 * uVar76 + iVar4 + iVar3 + 1;
                    if (iVar13 < 0) goto LAB_002c247c;
                    local_80.tv_nsec._0_4_ = iVar13 * 2;
                    sat_solver_addclause
                              (pSes->pSat,(lit *)&local_80,(lit *)((long)&local_80.tv_nsec + 4));
                    iVar12 = pSes->nArrTimeMax;
                    bVar2 = iVar4 < (int)(iVar12 + uVar73);
                    iVar4 = iVar4 + 1;
                  } while (bVar2);
                  iVar4 = pSes->nSpecVars;
                  iVar67 = (uint)local_70;
                  uVar79 = (uint)local_68;
                }
                uVar79 = uVar79 + 1;
                iVar12 = iVar4 + uVar73;
                iVar13 = iVar4;
              } while ((int)uVar79 < iVar12);
            }
            uVar73 = uVar73 + 1;
            uVar19 = (ulong)(uint)((int)local_50 + (int)local_60);
            iVar12 = (int)local_60 + 2;
          } while (uVar73 != uVar76);
          bVar2 = false;
        }
        if (pSes->pArrTimeProfile == (int *)0x0) {
          if (pSes->nGates <= (int)uVar76) {
LAB_002c0244:
            __assert_fail("i < pSes->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3f4,"int Ses_ManDepthVar(Ses_Man_t *, int, int)");
          }
          if ((int)(pSes->nArrTimeMax + uVar76) < 0) {
LAB_002c2581:
            __assert_fail("j <= pSes->nArrTimeMax + i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3f5,"int Ses_ManDepthVar(Ses_Man_t *, int, int)");
          }
          iVar3 = ((uVar76 + 1) * uVar76 >> 1) + pSes->nArrTimeMax * uVar76 + pSes->nDepthOffset;
          if (iVar3 < 0) goto LAB_002c247c;
          Vec_IntPush(pSes->vAssump,iVar3 * 2);
        }
        else {
          uVar73 = pSes->nSpecVars;
          if (1 < (int)(uVar73 + uVar76)) {
            lVar9 = 1;
            do {
              if (0 < (int)uVar73) {
                lVar20 = 0;
                do {
                  iVar3 = pSes->pArrTimeProfile[lVar20];
                  if ((lVar9 < (int)uVar73) && (iVar4 = pSes->pArrTimeProfile[lVar9], iVar3 < iVar4)
                     ) {
                    iVar3 = iVar4;
                  }
                  if (pSes->nGates <= (int)uVar76) goto LAB_002c24db;
                  iVar4 = uVar73 + uVar76;
                  if (iVar4 <= lVar9) goto LAB_002c253c;
                  uVar79 = pSes->nSelectOffset;
                  if (!bVar2) {
                    iVar13 = uVar73 + 1;
                    iVar12 = iVar13;
                    if (iVar13 < iVar4) {
                      iVar12 = iVar4;
                    }
                    uVar86 = ~uVar73 + iVar12;
                    iVar12 = uVar73 + 1;
                    uVar14 = uVar73 + 2;
                    iVar67 = uVar73 + 3;
                    if (iVar13 < iVar4) {
                      iVar13 = iVar4;
                    }
                    iVar13 = iVar13 - uVar73;
                    iVar72 = 4;
                    uVar69 = 0;
                    uVar53 = 0;
                    uVar80 = 0;
                    do {
                      uVar68 = uVar80;
                      uVar54 = uVar53;
                      uVar52 = uVar69;
                      uVar82 = uVar79;
                      auVar26._0_4_ = uVar73 - 1;
                      auVar26._4_4_ = iVar12 + -1;
                      auVar26._8_4_ = uVar14 - 1;
                      auVar26._12_4_ = iVar67 - 1;
                      auVar27._4_4_ = iVar12;
                      auVar27._0_4_ = iVar12;
                      auVar27._8_4_ = iVar67;
                      auVar27._12_4_ = iVar67;
                      uVar79 = (int)(auVar26._0_4_ * uVar73) / 2 + uVar82;
                      uVar69 = (iVar12 * auVar26._4_4_) / 2 + uVar52;
                      uVar53 = (int)((auVar26._8_8_ & 0xffffffff) * (ulong)uVar14) / 2 + uVar54;
                      uVar80 = (int)((auVar27._8_8_ & 0xffffffff) * (ulong)auVar26._12_4_) / 2 +
                               uVar68;
                      uVar73 = uVar73 + 4;
                      iVar12 = iVar12 + 4;
                      uVar14 = uVar14 + 4;
                      iVar67 = iVar67 + 4;
                      iVar11 = iVar72 + -4;
                      iVar15 = iVar72 + (iVar13 + 3U & 0xfffffffc);
                      iVar72 = iVar11;
                    } while (iVar15 != 8);
                    uVar73 = -iVar11;
                    uVar14 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)(uVar73 ^ 0x80000000));
                    uVar70 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)((uVar73 | 1) ^ 0x80000000));
                    uVar77 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)((uVar73 | 2) ^ 0x80000000));
                    uVar73 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)((uVar73 | 3) ^ 0x80000000));
                    uVar79 = (~uVar73 & uVar80 | uVar68 & uVar73) +
                             (~uVar70 & uVar69 | uVar52 & uVar70) +
                             (~uVar77 & uVar53 | uVar54 & uVar77) +
                             (~uVar14 & uVar79 | uVar82 & uVar14);
                  }
                  uVar73 = ~(uint)lVar20;
                  uVar86 = (uint)lVar9;
                  iVar4 = uVar73 + uVar86 + (int)((uVar73 + iVar4 * 2) * (uint)lVar20) / 2 + uVar79;
                  if (iVar4 < 0) goto LAB_002c247c;
                  local_80.tv_sec._0_4_ = iVar4 * 2 + 1;
                  if ((int)(pSes->nArrTimeMax + uVar76) < iVar3) goto LAB_002c2581;
                  iVar3 = iVar3 + ((uVar76 + 1) * uVar76 >> 1) + pSes->nArrTimeMax * uVar76 +
                          pSes->nDepthOffset;
                  if (iVar3 < 0) goto LAB_002c247c;
                  local_80.tv_sec._4_4_ = iVar3 * 2;
                  sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                  lVar20 = lVar20 + 1;
                  uVar73 = pSes->nSpecVars;
                  uVar79 = uVar73;
                  if ((int)uVar86 < (int)uVar73) {
                    uVar79 = uVar86;
                  }
                } while (lVar20 < (int)uVar79);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < (int)(uVar73 + uVar76));
          }
        }
        iVar4 = pSes->nArrTimeMax;
        iVar3 = iVar4 + uVar76;
        if (iVar3 != 0 && SCARRY4(iVar4,uVar76) == iVar3 < 0) {
          iVar13 = 0;
          uVar19 = local_38;
          do {
            if (pSes->nGates <= (int)uVar76) goto LAB_002c0244;
            iVar12 = (int)uVar19;
            iVar3 = iVar12 + iVar4 * uVar76 + pSes->nDepthOffset + 1;
            if (iVar3 < 0) goto LAB_002c247c;
            local_80.tv_sec._0_4_ = iVar3 * 2 + 1;
            iVar3 = pSes->nDepthOffset + iVar4 * uVar76 + iVar12;
            if (iVar3 < 0) goto LAB_002c247c;
            local_80.tv_sec._4_4_ = iVar3 * 2;
            sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
            iVar4 = pSes->nArrTimeMax;
            iVar3 = iVar4 + uVar76;
            uVar19 = (ulong)(iVar12 + 1);
            iVar13 = iVar13 + 1;
          } while (iVar13 < iVar3);
        }
        if ((pSes->nMaxDepth < iVar3) && (0 < pSes->nSpecFunc)) {
          iVar3 = 0;
          do {
            if (pSes->nGates <= (int)uVar76) goto LAB_002c25a0;
            iVar4 = pSes->nGates * iVar3 + uVar76 + pSes->nOutputOffset;
            if (iVar4 < 0) goto LAB_002c247c;
            local_80.tv_sec._0_4_ = iVar4 * 2 + 1;
            if ((int)(pSes->nArrTimeMax + uVar76) < pSes->nMaxDepth) goto LAB_002c2581;
            iVar4 = pSes->nMaxDepth + ((uVar76 + 1) * uVar76 >> 1) + pSes->nArrTimeMax * uVar76 +
                    pSes->nDepthOffset;
            if (iVar4 < 0) goto LAB_002c247c;
            local_80.tv_sec._4_4_ = iVar4 * 2 + 1;
            iVar4 = sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
            if (iVar4 == 0) {
              uVar19 = 1;
              lVar9 = local_48;
              goto LAB_002bff9d;
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 < pSes->nSpecFunc);
        }
        uVar76 = uVar76 + 1;
        uVar19 = (ulong)((int)local_40 + local_54);
        uVar73 = local_54 + 2;
      } while ((int)uVar76 < pSes->nGates);
      uVar19 = 0;
      lVar9 = local_48;
    }
LAB_002bff9d:
    iVar3 = clock_gettime(3,&local_80);
    if (iVar3 < 0) {
      lVar20 = -1;
    }
    else {
      lVar20 = CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec) / 1000 +
               CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * 1000000;
    }
    pSes->timeInstance = pSes->timeInstance + lVar20 + lVar9;
    if ((char)uVar19 != '\0') {
      return 2;
    }
  }
  psVar5 = pSes->pSat;
  piVar7 = pSes->vPolar->pArray;
  uVar73 = pSes->vPolar->nSize;
  if (0 < psVar5->size) {
    lVar9 = 0;
    do {
      psVar5->polarity[lVar9] = '\0';
      lVar9 = lVar9 + 1;
    } while (lVar9 < psVar5->size);
  }
  if (0 < (int)uVar73) {
    uVar19 = 0;
    do {
      psVar5->polarity[piVar7[uVar19]] = '\x01';
      uVar19 = uVar19 + 1;
    } while (uVar73 != uVar19);
  }
  iVar3 = Ses_ManSolve(pSes);
  if (iVar3 == 0) {
    return 2;
  }
  if (iVar3 == 2) goto LAB_002c0058;
  iVar3 = clock_gettime(3,&local_80);
  if (iVar3 < 0) {
    local_40 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec)),8);
    local_40 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) +
               CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * -1000000;
  }
  iVar3 = pSes->nRows;
  if (0 < iVar3) {
    uVar19 = 0;
    do {
      if ((pSes->pTtValues[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0) {
        iVar3 = Ses_ManCreateTruthTableClause(pSes,(int)uVar19);
        if (iVar3 == 0) {
          bVar2 = true;
          goto LAB_002c249d;
        }
        iVar3 = pSes->nRows;
      }
      uVar73 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar73;
    } while ((int)uVar73 < iVar3);
  }
  iVar3 = pSes->nSpecFunc;
  if (iVar3 == 1) {
    if (pSes->nGates < 2) {
      iVar3 = pSes->nGates + -1;
    }
    else {
      iVar4 = 0;
      do {
        if (pSes->nSpecFunc < 1) goto LAB_002c0156;
        iVar3 = pSes->nOutputOffset + iVar4;
        if (iVar3 < 0) goto LAB_002c247c;
        Vec_IntPush(pSes->vAssump,iVar3 * 2 + 1);
        iVar4 = iVar4 + 1;
        iVar3 = pSes->nGates + -1;
      } while (iVar4 < iVar3);
      if (pSes->nSpecFunc < 1) {
LAB_002c0156:
        __assert_fail("h < pSes->nSpecFunc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                      ,0x3d2,"int Ses_ManOutputVar(Ses_Man_t *, int, int)");
      }
    }
    iVar3 = iVar3 + pSes->nOutputOffset;
    if (iVar3 < 0) {
LAB_002c247c:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(pSes->vAssump,iVar3 * 2);
    pVVar6 = (Vec_Int_t *)calloc(1,0x10);
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc(1,0x10);
    if (0 < iVar3) {
      piVar7 = (int *)0x0;
      iVar3 = 0;
      do {
        iVar4 = pSes->nGates;
        pVVar6->nSize = iVar4;
        if (pVVar6->nCap < iVar4) {
          if (piVar7 == (int *)0x0) {
            piVar7 = (int *)malloc((long)iVar4 << 2);
          }
          else {
            piVar7 = (int *)realloc(piVar7,(long)iVar4 << 2);
          }
          pVVar6->pArray = piVar7;
          if (piVar7 == (int *)0x0) goto LAB_002c25de;
          pVVar6->nCap = iVar4;
          iVar4 = pSes->nGates;
        }
        if (0 < iVar4) {
          iVar13 = 0;
          do {
            if (pSes->nSpecFunc <= iVar3) goto LAB_002c0156;
            iVar4 = iVar4 * iVar3 + pSes->nOutputOffset + iVar13;
            if (iVar4 < 0) goto LAB_002c247c;
            Vec_IntSetEntry(pVVar6,iVar13,iVar4 * 2);
            iVar13 = iVar13 + 1;
            iVar4 = pSes->nGates;
          } while (iVar13 < iVar4);
          piVar7 = pVVar6->pArray;
        }
        sat_solver_addclause(pSes->pSat,piVar7,piVar7 + iVar4);
        iVar3 = iVar3 + 1;
      } while (iVar3 < pSes->nSpecFunc);
    }
  }
  iVar3 = pSes->nGates;
  local_68 = pVVar6;
  if (0 < iVar3) {
    iVar4 = 0;
    do {
      iVar3 = pSes->nSpecVars;
      iVar13 = iVar3 + iVar4;
      iVar12 = ((iVar3 + iVar4 + -1) * iVar13) / 2;
      pVVar6->nSize = iVar12;
      if (pVVar6->nCap < iVar12) {
        if (pVVar6->pArray == (int *)0x0) {
          piVar7 = (int *)malloc((long)iVar12 << 2);
        }
        else {
          piVar7 = (int *)realloc(pVVar6->pArray,(long)iVar12 << 2);
        }
        pVVar6->pArray = piVar7;
        if (piVar7 == (int *)0x0) goto LAB_002c25de;
        pVVar6->nCap = iVar12;
        iVar3 = pSes->nSpecVars;
        iVar13 = iVar3 + iVar4;
      }
      if (iVar13 < 1) {
        lVar9 = 0;
      }
      else {
        iVar13 = 0;
        uVar73 = 0;
        do {
          iVar67 = uVar73 + 1;
          iVar12 = iVar3 + iVar4;
          local_70 = CONCAT44(local_70._4_4_,iVar67);
          if (iVar67 < iVar12) {
            iVar72 = iVar13;
            do {
              if (pSes->nGates <= iVar4) goto LAB_002c24db;
              uVar76 = pSes->nSelectOffset;
              if (iVar4 != 0) {
                iVar13 = iVar3 + 1;
                if (iVar3 + 1 < iVar12) {
                  iVar13 = iVar12;
                }
                iVar13 = iVar13 - iVar3;
                uVar69 = iVar13 - 1;
                iVar15 = iVar3 + 1;
                uVar53 = iVar3 + 2;
                iVar87 = iVar3 + 3;
                iVar11 = 4;
                uVar79 = 0;
                uVar86 = 0;
                uVar14 = 0;
                do {
                  uVar54 = uVar14;
                  uVar52 = uVar86;
                  uVar82 = uVar79;
                  uVar80 = uVar76;
                  auVar55._0_4_ = iVar3 + -1;
                  auVar55._4_4_ = iVar15 + -1;
                  auVar55._8_4_ = uVar53 - 1;
                  auVar55._12_4_ = iVar87 - 1;
                  auVar56._4_4_ = iVar15;
                  auVar56._0_4_ = iVar15;
                  auVar56._8_4_ = iVar87;
                  auVar56._12_4_ = iVar87;
                  uVar76 = (auVar55._0_4_ * iVar3) / 2 + uVar80;
                  uVar79 = (iVar15 * auVar55._4_4_) / 2 + uVar82;
                  uVar86 = (int)((auVar55._8_8_ & 0xffffffff) * (ulong)uVar53) / 2 + uVar52;
                  uVar14 = (int)((auVar56._8_8_ & 0xffffffff) * (ulong)auVar55._12_4_) / 2 + uVar54;
                  iVar3 = iVar3 + 4;
                  iVar15 = iVar15 + 4;
                  uVar53 = uVar53 + 4;
                  iVar87 = iVar87 + 4;
                  iVar16 = iVar11 + -4;
                  iVar17 = iVar11 + (iVar13 + 3U & 0xfffffffc);
                  iVar11 = iVar16;
                } while (iVar17 != 8);
                uVar53 = -iVar16;
                uVar68 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)(uVar53 ^ 0x80000000));
                uVar70 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)((uVar53 | 1) ^ 0x80000000));
                uVar77 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)((uVar53 | 2) ^ 0x80000000));
                uVar69 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)((uVar53 | 3) ^ 0x80000000));
                uVar76 = (~uVar69 & uVar14 | uVar54 & uVar69) + (~uVar70 & uVar79 | uVar82 & uVar70)
                         + (~uVar77 & uVar86 | uVar52 & uVar77) +
                           (~uVar68 & uVar76 | uVar80 & uVar68);
              }
              iVar3 = (int)((~uVar73 + iVar12 * 2) * uVar73) / 2 + iVar67 + ~uVar73 + uVar76;
              if (iVar3 < 0) goto LAB_002c247c;
              iVar13 = iVar72 + 1;
              Vec_IntSetEntry(local_68,iVar72,iVar3 * 2);
              iVar67 = iVar67 + 1;
              iVar3 = pSes->nSpecVars;
              iVar12 = iVar3 + iVar4;
              iVar72 = iVar13;
            } while (iVar67 < iVar12);
          }
          uVar73 = (uint)local_70;
        } while ((int)(uint)local_70 < iVar12);
        lVar9 = (long)iVar13;
        pVVar6 = local_68;
      }
      sat_solver_addclause(pSes->pSat,pVVar6->pArray,pVVar6->pArray + lVar9);
      iVar4 = iVar4 + 1;
      iVar3 = pSes->nGates;
    } while (iVar4 < iVar3);
  }
  if (pSes->fMakeAIG == 0) {
LAB_002c060a:
    if (0 < iVar3) {
      iVar4 = 0;
      plVar1 = (lit *)((long)&local_80.tv_nsec + 4);
      iVar13 = 0;
      do {
        iVar3 = pSes->nGateOffset + iVar4;
        if (iVar3 < 0) goto LAB_002c247c;
        local_80.tv_sec._0_4_ = iVar3 * 2;
        if (iVar3 + 1 < 0) goto LAB_002c247c;
        local_80.tv_sec._4_4_ = (iVar3 + 1) * 2;
        if (iVar3 + 2 < 0) goto LAB_002c247c;
        local_80.tv_nsec._0_4_ = (iVar3 + 2) * 2;
        sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
        if (pSes->nGates <= iVar13) goto LAB_002c25bf;
        iVar3 = pSes->nGateOffset + iVar4;
        if (iVar3 < 0) goto LAB_002c247c;
        local_80.tv_sec._0_4_ = iVar3 * 2 + 1;
        if (iVar3 + 1 < 0) goto LAB_002c247c;
        local_80.tv_sec._4_4_ = (iVar3 + 1) * 2;
        if (iVar3 + 2 < 0) goto LAB_002c247c;
        local_80.tv_nsec._0_4_ = (iVar3 + 2) * 2 + 1;
        sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
        if (pSes->nGates <= iVar13) goto LAB_002c25bf;
        iVar3 = pSes->nGateOffset + iVar4;
        if (iVar3 < 0) goto LAB_002c247c;
        local_80.tv_sec._0_4_ = iVar3 * 2;
        if (iVar3 + 1 < 0) goto LAB_002c247c;
        local_80.tv_sec._4_4_ = (iVar3 + 1) * 2 + 1;
        if (iVar3 + 2 < 0) goto LAB_002c247c;
        local_80.tv_nsec._0_4_ = (iVar3 + 2) * 2 + 1;
        sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
        iVar13 = iVar13 + 1;
        iVar3 = pSes->nGates;
        iVar4 = iVar4 + 3;
      } while (iVar13 < iVar3);
      pVVar6 = local_68;
      if (0 < iVar3) {
        uVar73 = pSes->nSpecVars;
        iVar4 = 0;
        do {
          if (1 < (int)(iVar4 + uVar73)) {
            local_70 = CONCAT44(local_70._4_4_,1);
            local_60 = CONCAT44(local_60._4_4_,1 - iVar4);
            do {
              uVar76 = 0;
              do {
                if (pSes->nGates <= iVar4) goto LAB_002c24db;
                iVar3 = uVar73 + iVar4;
                if (iVar3 <= (int)(uint)local_70) goto LAB_002c253c;
                uVar79 = pSes->nSelectOffset;
                if (iVar4 != 0) {
                  iVar12 = uVar73 + 1;
                  iVar13 = iVar12;
                  if (iVar12 < iVar3) {
                    iVar13 = iVar3;
                  }
                  uVar86 = ~uVar73 + iVar13;
                  iVar13 = uVar73 + 1;
                  uVar14 = uVar73 + 2;
                  iVar67 = uVar73 + 3;
                  if (iVar12 < iVar3) {
                    iVar12 = iVar3;
                  }
                  iVar72 = 4;
                  uVar69 = 0;
                  uVar53 = 0;
                  uVar80 = 0;
                  uVar82 = uVar73;
                  do {
                    uVar70 = uVar80;
                    uVar68 = uVar53;
                    uVar54 = uVar69;
                    uVar52 = uVar79;
                    auVar28._0_4_ = uVar82 - 1;
                    auVar28._4_4_ = iVar13 + -1;
                    auVar28._8_4_ = uVar14 - 1;
                    auVar28._12_4_ = iVar67 - 1;
                    auVar29._4_4_ = iVar13;
                    auVar29._0_4_ = iVar13;
                    auVar29._8_4_ = iVar67;
                    auVar29._12_4_ = iVar67;
                    uVar79 = (int)(auVar28._0_4_ * uVar82) / 2 + uVar52;
                    uVar69 = (iVar13 * auVar28._4_4_) / 2 + uVar54;
                    uVar53 = (int)((auVar28._8_8_ & 0xffffffff) * (ulong)uVar14) / 2 + uVar68;
                    uVar80 = (int)((auVar29._8_8_ & 0xffffffff) * (ulong)auVar28._12_4_) / 2 +
                             uVar70;
                    uVar82 = uVar82 + 4;
                    iVar13 = iVar13 + 4;
                    uVar14 = uVar14 + 4;
                    iVar67 = iVar67 + 4;
                    iVar11 = iVar72 + -4;
                    iVar15 = iVar72 + ((iVar12 - uVar73) + 3 & 0xfffffffc);
                    iVar72 = iVar11;
                  } while (iVar15 != 8);
                  uVar14 = -iVar11;
                  uVar82 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)(uVar14 ^ 0x80000000));
                  uVar77 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)((uVar14 | 1) ^ 0x80000000));
                  uVar81 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)((uVar14 | 2) ^ 0x80000000));
                  uVar86 = -(uint)((int)(uVar86 ^ 0x80000000) < (int)((uVar14 | 3) ^ 0x80000000));
                  uVar79 = (~uVar86 & uVar80 | uVar70 & uVar86) +
                           (~uVar77 & uVar69 | uVar54 & uVar77) +
                           (~uVar81 & uVar53 | uVar68 & uVar81) +
                           (~uVar82 & uVar79 | uVar52 & uVar82);
                }
                iVar3 = ~uVar76 + (uint)local_70 + (int)((~uVar76 + iVar3 * 2) * uVar76) / 2 +
                        uVar79;
                if (iVar3 < 0) goto LAB_002c247c;
                local_80.tv_sec._0_4_ = iVar3 * 2 + 1;
                if ((int)local_60 < (int)uVar73) {
                  uVar79 = 1;
                  do {
                    uVar86 = 0;
                    uVar73 = (uint)local_70;
                    do {
                      if (uVar76 != uVar86 || uVar73 != uVar79) {
                        if (pSes->nGates <= iVar4) goto LAB_002c24db;
                        uVar14 = pSes->nSpecVars;
                        iVar3 = uVar14 + iVar4;
                        if (iVar3 <= (int)uVar79) goto LAB_002c253c;
                        uVar69 = pSes->nSelectOffset;
                        if (iVar4 != 0) {
                          iVar12 = uVar14 + 1;
                          iVar13 = iVar12;
                          if (iVar12 < iVar3) {
                            iVar13 = iVar3;
                          }
                          uVar53 = ~uVar14 + iVar13;
                          iVar13 = uVar14 + 1;
                          uVar80 = uVar14 + 2;
                          iVar67 = uVar14 + 3;
                          if (iVar12 < iVar3) {
                            iVar12 = iVar3;
                          }
                          iVar12 = iVar12 - uVar14;
                          iVar72 = 4;
                          uVar82 = 0;
                          uVar52 = 0;
                          uVar54 = 0;
                          do {
                            uVar81 = uVar54;
                            uVar77 = uVar52;
                            uVar70 = uVar82;
                            uVar68 = uVar69;
                            auVar30._0_4_ = uVar14 - 1;
                            auVar30._4_4_ = iVar13 + -1;
                            auVar30._8_4_ = uVar80 - 1;
                            auVar30._12_4_ = iVar67 - 1;
                            auVar31._4_4_ = iVar13;
                            auVar31._0_4_ = iVar13;
                            auVar31._8_4_ = iVar67;
                            auVar31._12_4_ = iVar67;
                            uVar69 = (int)(auVar30._0_4_ * uVar14) / 2 + uVar68;
                            uVar82 = (iVar13 * auVar30._4_4_) / 2 + uVar70;
                            uVar52 = (int)((auVar30._8_8_ & 0xffffffff) * (ulong)uVar80) / 2 +
                                     uVar77;
                            uVar54 = (int)((auVar31._8_8_ & 0xffffffff) * (ulong)auVar30._12_4_) / 2
                                     + uVar81;
                            uVar14 = uVar14 + 4;
                            iVar13 = iVar13 + 4;
                            uVar80 = uVar80 + 4;
                            iVar67 = iVar67 + 4;
                            iVar11 = iVar72 + -4;
                            iVar15 = iVar72 + (iVar12 + 3U & 0xfffffffc);
                            iVar72 = iVar11;
                          } while (iVar15 != 8);
                          uVar14 = -iVar11;
                          uVar80 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)(uVar14 ^ 0x80000000));
                          uVar83 = -(uint)((int)(uVar53 ^ 0x80000000) <
                                          (int)((uVar14 | 1) ^ 0x80000000));
                          uVar71 = -(uint)((int)(uVar53 ^ 0x80000000) <
                                          (int)((uVar14 | 2) ^ 0x80000000));
                          uVar14 = -(uint)((int)(uVar53 ^ 0x80000000) <
                                          (int)((uVar14 | 3) ^ 0x80000000));
                          uVar69 = (~uVar14 & uVar54 | uVar81 & uVar14) +
                                   (~uVar83 & uVar82 | uVar70 & uVar83) +
                                   (~uVar71 & uVar52 | uVar77 & uVar71) +
                                   (~uVar80 & uVar69 | uVar68 & uVar80);
                        }
                        iVar3 = ~uVar86 + uVar79 + (int)((~uVar86 + iVar3 * 2) * uVar86) / 2 +
                                uVar69;
                        if (iVar3 < 0) goto LAB_002c247c;
                        local_80.tv_sec._4_4_ = iVar3 * 2 + 1;
                        if ((int)local_80.tv_sec <= iVar3 * 2) {
                          sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec)
                          ;
                        }
                      }
                      uVar86 = uVar86 + 1;
                    } while (uVar86 != uVar79);
                    uVar79 = uVar79 + 1;
                    uVar73 = pSes->nSpecVars;
                  } while ((int)uVar79 < (int)(uVar73 + iVar4));
                }
                uVar76 = uVar76 + 1;
              } while (uVar76 != (uint)local_70);
              iVar3 = (uint)local_70 + 1;
              local_70 = CONCAT44(local_70._4_4_,iVar3);
            } while (iVar3 < (int)(uVar73 + iVar4));
            iVar3 = pSes->nGates;
            pVVar6 = local_68;
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < iVar3);
      }
    }
  }
  else if (0 < iVar3) {
    iVar4 = 0;
    plVar1 = (lit *)((long)&local_80.tv_nsec + 4);
    iVar13 = 0;
    do {
      iVar3 = pSes->nGateOffset + iVar4;
      if (iVar3 < 0) goto LAB_002c247c;
      local_80.tv_sec._0_4_ = iVar3 * 2 + 1;
      if (iVar3 + 1 < 0) goto LAB_002c247c;
      local_80.tv_sec._4_4_ = (iVar3 + 1) * 2 + 1;
      if (iVar3 + 2 < 0) goto LAB_002c247c;
      local_80.tv_nsec._0_4_ = (iVar3 + 2) * 2;
      sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
      if (pSes->nGates <= iVar13) goto LAB_002c25bf;
      iVar3 = pSes->nGateOffset + iVar4;
      if (iVar3 < 0) goto LAB_002c247c;
      local_80.tv_sec._0_4_ = iVar3 * 2 + 1;
      if (iVar3 + 1 < 0) goto LAB_002c247c;
      local_80.tv_sec._4_4_ = (iVar3 + 1) * 2;
      if (iVar3 + 2 < 0) goto LAB_002c247c;
      local_80.tv_nsec._0_4_ = (iVar3 + 2) * 2 + 1;
      sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
      if (pSes->nGates <= iVar13) goto LAB_002c25bf;
      iVar3 = pSes->nGateOffset + iVar4;
      if (iVar3 < 0) goto LAB_002c247c;
      local_80.tv_sec._0_4_ = iVar3 * 2;
      if (iVar3 + 1 < 0) goto LAB_002c247c;
      local_80.tv_sec._4_4_ = (iVar3 + 1) * 2 + 1;
      if (iVar3 + 2 < 0) goto LAB_002c247c;
      local_80.tv_nsec._0_4_ = (iVar3 + 2) * 2 + 1;
      sat_solver_addclause(pSes->pSat,(lit *)&local_80,plVar1);
      iVar13 = iVar13 + 1;
      iVar3 = pSes->nGates;
      iVar4 = iVar4 + 3;
    } while (iVar13 < iVar3);
    goto LAB_002c060a;
  }
  pVVar8 = pSes->vStairDecVars;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    iVar3 = -1;
    uVar73 = 0;
    do {
      uVar76 = pVVar8->pArray[lVar9];
      iVar4 = pSes->nGates;
      iVar13 = iVar4 + uVar73 + -2;
      uVar73 = ~(uint)lVar9;
      if ((int)uVar76 <= iVar13) {
        iVar12 = iVar4 + uVar73;
        if (iVar4 <= iVar12) {
LAB_002c24db:
          __assert_fail("i < pSes->nGates",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                        ,999,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
        }
        uVar79 = pSes->nSpecVars;
        iVar13 = iVar13 + uVar79;
        iVar67 = uVar79 + iVar12;
        if (iVar67 <= iVar13) {
LAB_002c253c:
          __assert_fail("k < pSes->nSpecVars + i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                        ,1000,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
        }
        if (iVar13 <= (int)uVar76) {
LAB_002c2562:
          __assert_fail("j < k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                        ,0x3e9,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
        }
        uVar86 = pSes->nSelectOffset;
        if (0 < iVar12) {
          iVar12 = uVar79 + 1;
          iVar72 = iVar12;
          if (iVar12 < iVar67) {
            iVar72 = iVar67;
          }
          uVar14 = ~uVar79 + iVar72;
          iVar72 = uVar79 + 1;
          uVar69 = uVar79 + 2;
          iVar11 = uVar79 + 3;
          iVar4 = iVar4 + uVar79 + iVar3;
          if (iVar4 <= iVar12) {
            iVar4 = iVar12;
          }
          iVar4 = iVar4 - uVar79;
          iVar12 = 4;
          uVar53 = 0;
          uVar80 = 0;
          uVar82 = 0;
          do {
            uVar70 = uVar82;
            uVar68 = uVar80;
            uVar54 = uVar53;
            uVar52 = uVar86;
            auVar32._0_4_ = uVar79 - 1;
            auVar32._4_4_ = iVar72 + -1;
            auVar32._8_4_ = uVar69 - 1;
            auVar32._12_4_ = iVar11 - 1;
            auVar33._4_4_ = iVar72;
            auVar33._0_4_ = iVar72;
            auVar33._8_4_ = iVar11;
            auVar33._12_4_ = iVar11;
            uVar86 = (int)(auVar32._0_4_ * uVar79) / 2 + uVar52;
            uVar53 = (iVar72 * auVar32._4_4_) / 2 + uVar54;
            uVar80 = (int)((auVar32._8_8_ & 0xffffffff) * (ulong)uVar69) / 2 + uVar68;
            uVar82 = (int)((auVar33._8_8_ & 0xffffffff) * (ulong)auVar32._12_4_) / 2 + uVar70;
            uVar79 = uVar79 + 4;
            iVar72 = iVar72 + 4;
            uVar69 = uVar69 + 4;
            iVar11 = iVar11 + 4;
            iVar15 = iVar12 + -4;
            iVar87 = iVar12 + (iVar4 + 3U & 0xfffffffc);
            iVar12 = iVar15;
          } while (iVar87 != 8);
          uVar79 = -iVar15;
          uVar69 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar79 ^ 0x80000000));
          uVar77 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)((uVar79 | 1) ^ 0x80000000));
          uVar81 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)((uVar79 | 2) ^ 0x80000000));
          uVar79 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)((uVar79 | 3) ^ 0x80000000));
          uVar86 = (~uVar79 & uVar82 | uVar70 & uVar79) + (~uVar77 & uVar53 | uVar54 & uVar77) +
                   (~uVar81 & uVar80 | uVar68 & uVar81) + (~uVar69 & uVar86 | uVar52 & uVar69);
        }
        iVar4 = iVar13 + ~uVar76 + (int)((~uVar76 + iVar67 * 2) * uVar76) / 2 + uVar86;
        if (iVar4 < 0) goto LAB_002c247c;
        Vec_IntPush(pSes->vAssump,iVar4 * 2);
        switch(pSes->pStairDecFunc[lVar9]) {
        case 1:
          iVar4 = pSes->nGates + uVar73;
          if (iVar4 < pSes->nGates) {
            iVar4 = iVar4 * 3 + pSes->nGateOffset;
            if (-1 < iVar4) goto LAB_002c0d41;
            goto LAB_002c247c;
          }
          goto LAB_002c25bf;
        case 2:
          iVar4 = pSes->nGates + uVar73;
          if (pSes->nGates <= iVar4) goto LAB_002c25bf;
          iVar4 = iVar4 * 3 + pSes->nGateOffset + 1;
          if (iVar4 < 0) goto LAB_002c247c;
          pVVar8 = pSes->vAssump;
          iVar4 = iVar4 * 2 + 1;
          break;
        case 3:
          iVar4 = pSes->nGates + uVar73;
          if (iVar4 < pSes->nGates) {
            iVar4 = iVar4 * 3 + pSes->nGateOffset + 1;
            if (-1 < iVar4) {
              Vec_IntPush(pSes->vAssump,iVar4 * 2);
              iVar4 = pSes->nGates + uVar73;
              if (iVar4 < pSes->nGates) {
                iVar4 = iVar4 * 3 + pSes->nGateOffset + 2;
                if (-1 < iVar4) {
                  pVVar8 = pSes->vAssump;
                  iVar4 = iVar4 * 2;
                  goto LAB_002c0daf;
                }
                goto LAB_002c247c;
              }
              goto LAB_002c25bf;
            }
            goto LAB_002c247c;
          }
          goto LAB_002c25bf;
        case 4:
          goto switchD_002c0c62_caseD_4;
        case 5:
          iVar4 = pSes->nGates + uVar73;
          if (pSes->nGates <= iVar4) {
LAB_002c25bf:
            __assert_fail("i < pSes->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3da,"int Ses_ManGateVar(Ses_Man_t *, int, int, int)");
          }
          iVar4 = iVar4 * 3 + pSes->nGateOffset;
          if (iVar4 < 0) goto LAB_002c247c;
          Vec_IntPush(pSes->vAssump,iVar4 * 2);
          iVar4 = pSes->nGates + uVar73;
          if (pSes->nGates <= iVar4) goto LAB_002c25bf;
          iVar4 = iVar4 * 3 + pSes->nGateOffset + 1;
          if (iVar4 < 0) goto LAB_002c247c;
          pVVar8 = pSes->vAssump;
          iVar4 = iVar4 * 2;
          break;
        default:
          printf("func: %d\n");
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                        ,0x569,"int Ses_ManCreateClauses(Ses_Man_t *)");
        }
        Vec_IntPush(pVVar8,iVar4);
        iVar4 = pSes->nGates + uVar73;
        if (pSes->nGates <= iVar4) goto LAB_002c25bf;
        iVar4 = iVar4 * 3 + pSes->nGateOffset + 2;
        if (iVar4 < 0) goto LAB_002c247c;
LAB_002c0d41:
        pVVar8 = pSes->vAssump;
        iVar4 = iVar4 * 2 + 1;
LAB_002c0daf:
        Vec_IntPush(pVVar8,iVar4);
      }
switchD_002c0c62_caseD_4:
      lVar9 = lVar9 + 1;
      pVVar8 = pSes->vStairDecVars;
      iVar3 = iVar3 + -1;
    } while (lVar9 < pVVar8->nSize);
    iVar3 = pSes->nGates;
  }
  lVar9 = (long)((pSes->nSpecVars + iVar3 + -2) * iVar3) + (long)pSes->nSpecFunc;
  iVar4 = (int)lVar9;
  pVVar6->nSize = iVar4;
  if (pVVar6->nCap < iVar4) {
    __size = lVar9 * 4;
    if (pVVar6->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(__size);
    }
    else {
      piVar7 = (int *)realloc(pVVar6->pArray,__size);
    }
    pVVar6->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_002c25de:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x22c,"void Vec_IntGrowResize(Vec_Int_t *, int)");
    }
    pVVar6->nCap = iVar4;
    iVar3 = pSes->nGates;
  }
  if (0 < iVar3) {
    uVar73 = 0;
    do {
      iVar4 = 0;
      if (0 < pSes->nSpecFunc) {
        iVar3 = 0;
        do {
          if (pSes->nGates <= (int)uVar73) {
LAB_002c25a0:
            __assert_fail("i < pSes->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3d3,"int Ses_ManOutputVar(Ses_Man_t *, int, int)");
          }
          iVar13 = pSes->nGates * iVar3 + uVar73 + pSes->nOutputOffset;
          if (iVar13 < 0) goto LAB_002c247c;
          iVar4 = iVar3 + 1;
          Vec_IntSetEntry(pVVar6,iVar3,iVar13 * 2);
          iVar3 = iVar4;
        } while (iVar4 < pSes->nSpecFunc);
        iVar3 = pSes->nGates;
      }
      uVar76 = uVar73 + 1;
      local_70 = CONCAT44(local_70._4_4_,uVar76);
      if ((int)uVar76 < iVar3) {
        uVar79 = pSes->nSpecVars;
        do {
          iVar3 = uVar79 + uVar73;
          if (iVar3 != 0 && SCARRY4(uVar79,uVar73) == iVar3 < 0) {
            uVar86 = 0;
            iVar13 = iVar4;
            do {
              if (pSes->nGates <= (int)uVar76) goto LAB_002c24db;
              if (uVar76 <= uVar73) goto LAB_002c253c;
              iVar4 = iVar13 + 1;
              iVar72 = uVar79 + uVar76;
              iVar67 = uVar79 + 1;
              iVar12 = iVar67;
              if (iVar67 < iVar72) {
                iVar12 = iVar72;
              }
              uVar14 = ~uVar79 + iVar12;
              iVar12 = uVar79 + 1;
              uVar69 = uVar79 + 2;
              iVar11 = uVar79 + 3;
              if (iVar67 < iVar72) {
                iVar67 = iVar72;
              }
              iVar67 = iVar67 - uVar79;
              iVar15 = 4;
              uVar53 = pSes->nSelectOffset;
              uVar80 = 0;
              uVar82 = 0;
              uVar52 = 0;
              do {
                uVar77 = uVar52;
                uVar70 = uVar82;
                uVar68 = uVar80;
                uVar54 = uVar53;
                auVar34._0_4_ = uVar79 - 1;
                auVar34._4_4_ = iVar12 + -1;
                auVar34._8_4_ = uVar69 - 1;
                auVar34._12_4_ = iVar11 - 1;
                auVar35._4_4_ = iVar12;
                auVar35._0_4_ = iVar12;
                auVar35._8_4_ = iVar11;
                auVar35._12_4_ = iVar11;
                uVar53 = (int)(auVar34._0_4_ * uVar79) / 2 + uVar54;
                uVar80 = (iVar12 * auVar34._4_4_) / 2 + uVar68;
                uVar82 = (int)((auVar34._8_8_ & 0xffffffff) * (ulong)uVar69) / 2 + uVar70;
                uVar52 = (int)((auVar35._8_8_ & 0xffffffff) * (ulong)auVar34._12_4_) / 2 + uVar77;
                uVar79 = uVar79 + 4;
                iVar12 = iVar12 + 4;
                uVar69 = uVar69 + 4;
                iVar11 = iVar11 + 4;
                iVar87 = iVar15 + -4;
                iVar16 = iVar15 + (iVar67 + 3U & 0xfffffffc);
                iVar15 = iVar87;
              } while (iVar16 != 8);
              uVar79 = -iVar87;
              uVar69 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar79 ^ 0x80000000));
              uVar81 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)((uVar79 | 1) ^ 0x80000000));
              uVar83 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)((uVar79 | 2) ^ 0x80000000));
              uVar79 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)((uVar79 | 3) ^ 0x80000000));
              iVar3 = iVar3 + ~uVar86 + (int)((~uVar86 + iVar72 * 2) * uVar86) / 2 +
                      (~uVar79 & uVar52 | uVar77 & uVar79) + (~uVar81 & uVar80 | uVar68 & uVar81) +
                      (~uVar83 & uVar82 | uVar70 & uVar83) + (~uVar69 & uVar53 | uVar54 & uVar69);
              if (iVar3 < 0) goto LAB_002c247c;
              Vec_IntSetEntry(local_68,iVar13,iVar3 * 2);
              uVar86 = uVar86 + 1;
              uVar79 = pSes->nSpecVars;
              iVar3 = uVar79 + uVar73;
              iVar13 = iVar4;
            } while ((int)uVar86 < iVar3);
          }
          while( true ) {
            iVar13 = uVar79 + uVar76;
            if (iVar13 <= iVar3 + 1) break;
            if (pSes->nGates <= (int)uVar76) goto LAB_002c24db;
            uVar86 = uVar79 + uVar73;
            if (iVar3 < (int)uVar86) goto LAB_002c2562;
            iVar12 = uVar79 + 1;
            if ((int)(uVar79 + 1) < iVar13) {
              iVar12 = iVar13;
            }
            iVar12 = iVar12 - uVar79;
            uVar82 = iVar12 - 1;
            iVar72 = uVar79 + 1;
            uVar52 = uVar79 + 2;
            iVar11 = uVar79 + 3;
            iVar67 = 4;
            uVar14 = pSes->nSelectOffset;
            uVar69 = 0;
            uVar53 = 0;
            uVar80 = 0;
            do {
              uVar77 = uVar80;
              uVar70 = uVar53;
              uVar68 = uVar69;
              uVar54 = uVar14;
              auVar57._0_4_ = uVar79 - 1;
              auVar57._4_4_ = iVar72 + -1;
              auVar57._8_4_ = uVar52 - 1;
              auVar57._12_4_ = iVar11 - 1;
              auVar58._4_4_ = iVar72;
              auVar58._0_4_ = iVar72;
              auVar58._8_4_ = iVar11;
              auVar58._12_4_ = iVar11;
              uVar14 = (int)(auVar57._0_4_ * uVar79) / 2 + uVar54;
              uVar69 = (iVar72 * auVar57._4_4_) / 2 + uVar68;
              uVar53 = (int)((auVar57._8_8_ & 0xffffffff) * (ulong)uVar52) / 2 + uVar70;
              uVar80 = (int)((auVar58._8_8_ & 0xffffffff) * (ulong)auVar57._12_4_) / 2 + uVar77;
              uVar79 = uVar79 + 4;
              iVar72 = iVar72 + 4;
              uVar52 = uVar52 + 4;
              iVar11 = iVar11 + 4;
              iVar15 = iVar67 + -4;
              iVar87 = iVar67 + (iVar12 + 3U & 0xfffffffc);
              iVar67 = iVar15;
            } while (iVar87 != 8);
            uVar79 = -iVar15;
            uVar52 = -(uint)((int)(uVar82 ^ 0x80000000) < (int)(uVar79 ^ 0x80000000));
            uVar81 = -(uint)((int)(uVar82 ^ 0x80000000) < (int)((uVar79 | 1) ^ 0x80000000));
            uVar83 = -(uint)((int)(uVar82 ^ 0x80000000) < (int)((uVar79 | 2) ^ 0x80000000));
            uVar79 = -(uint)((int)(uVar82 ^ 0x80000000) < (int)((uVar79 | 3) ^ 0x80000000));
            iVar13 = (iVar3 - uVar86) + (int)((~uVar86 + iVar13 * 2) * uVar86) / 2 +
                     (~uVar79 & uVar80 | uVar77 & uVar79) + (~uVar81 & uVar69 | uVar68 & uVar81) +
                     (~uVar83 & uVar53 | uVar70 & uVar83) + (~uVar52 & uVar14 | uVar54 & uVar52);
            if (iVar13 < 0) goto LAB_002c247c;
            Vec_IntSetEntry(local_68,iVar4,iVar13 * 2);
            uVar79 = pSes->nSpecVars;
            iVar3 = iVar3 + 1;
            iVar4 = iVar4 + 1;
          }
          uVar76 = uVar76 + 1;
        } while ((int)uVar76 < pSes->nGates);
      }
      pVVar6 = local_68;
      sat_solver_addclause(pSes->pSat,local_68->pArray,local_68->pArray + iVar4);
      iVar3 = pSes->nGates;
      uVar73 = (uint)local_70;
    } while ((int)(uint)local_70 < iVar3);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    iVar3 = pSes->nGates;
  }
  free(pVVar6);
  if (1 < iVar3) {
    uVar73 = 0;
    do {
      uVar76 = uVar73 + 1;
      local_70 = CONCAT44(local_70._4_4_,uVar76);
      if ((int)uVar76 < iVar3) {
        iVar13 = 1 - uVar73;
        iVar4 = pSes->nSpecVars;
        local_68 = (Vec_Int_t *)CONCAT44(local_68._4_4_,iVar13);
        do {
          if (iVar13 < iVar4) {
            uVar79 = 1;
            do {
              uVar86 = 0;
              do {
                if (pSes->nGates <= (int)uVar73) goto LAB_002c24db;
                uVar14 = pSes->nSpecVars;
                iVar3 = uVar14 + uVar73;
                if (iVar3 <= (int)uVar79) goto LAB_002c253c;
                uVar69 = pSes->nSelectOffset;
                uVar53 = uVar69;
                if (uVar73 != 0) {
                  iVar13 = uVar14 + 1;
                  iVar4 = iVar13;
                  if (iVar13 < iVar3) {
                    iVar4 = iVar3;
                  }
                  uVar53 = iVar4 + ~uVar14;
                  iVar4 = uVar14 + 1;
                  uVar80 = uVar14 + 2;
                  iVar12 = uVar14 + 3;
                  if (iVar13 < iVar3) {
                    iVar13 = iVar3;
                  }
                  iVar67 = 4;
                  uVar82 = uVar69;
                  uVar52 = 0;
                  uVar54 = 0;
                  uVar68 = 0;
                  uVar70 = uVar14;
                  do {
                    uVar71 = uVar68;
                    uVar83 = uVar54;
                    uVar81 = uVar52;
                    uVar77 = uVar82;
                    auVar36._0_4_ = uVar70 - 1;
                    auVar36._4_4_ = iVar4 + -1;
                    auVar36._8_4_ = uVar80 - 1;
                    auVar36._12_4_ = iVar12 - 1;
                    auVar37._4_4_ = iVar4;
                    auVar37._0_4_ = iVar4;
                    auVar37._8_4_ = iVar12;
                    auVar37._12_4_ = iVar12;
                    uVar82 = (int)(auVar36._0_4_ * uVar70) / 2 + uVar77;
                    uVar52 = (iVar4 * auVar36._4_4_) / 2 + uVar81;
                    uVar54 = (int)((auVar36._8_8_ & 0xffffffff) * (ulong)uVar80) / 2 + uVar83;
                    uVar68 = (int)((auVar37._8_8_ & 0xffffffff) * (ulong)auVar36._12_4_) / 2 +
                             uVar71;
                    uVar70 = uVar70 + 4;
                    iVar4 = iVar4 + 4;
                    uVar80 = uVar80 + 4;
                    iVar12 = iVar12 + 4;
                    iVar72 = iVar67 + -4;
                    iVar11 = iVar67 + ((iVar13 - uVar14) + 3 & 0xfffffffc);
                    iVar67 = iVar72;
                  } while (iVar11 != 8);
                  uVar80 = -iVar72;
                  uVar70 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)(uVar80 ^ 0x80000000));
                  uVar78 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar80 | 1) ^ 0x80000000));
                  uVar84 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar80 | 2) ^ 0x80000000));
                  uVar53 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar80 | 3) ^ 0x80000000));
                  uVar53 = (~uVar53 & uVar68 | uVar71 & uVar53) +
                           (~uVar78 & uVar52 | uVar81 & uVar78) +
                           (~uVar84 & uVar54 | uVar83 & uVar84) +
                           (~uVar70 & uVar82 | uVar77 & uVar70);
                }
                uVar80 = ~uVar86;
                iVar4 = (int)((uVar80 + iVar3 * 2) * uVar86) / 2 + uVar79 + uVar80 + uVar53;
                if (iVar4 < 0) goto LAB_002c247c;
                local_80.tv_sec._0_4_ = iVar4 * 2 + 1;
                if (pSes->nGates <= (int)uVar76) goto LAB_002c24db;
                if (uVar76 <= uVar73) goto LAB_002c253c;
                iVar12 = uVar14 + uVar76;
                iVar13 = uVar14 + 1;
                iVar4 = iVar13;
                if (iVar13 < iVar12) {
                  iVar4 = iVar12;
                }
                uVar53 = ~uVar14 + iVar4;
                iVar4 = uVar14 + 1;
                uVar82 = uVar14 + 2;
                iVar67 = uVar14 + 3;
                if (iVar13 < iVar12) {
                  iVar13 = iVar12;
                }
                iVar13 = iVar13 - uVar14;
                iVar72 = 4;
                uVar52 = 0;
                uVar54 = 0;
                uVar68 = 0;
                do {
                  uVar83 = uVar68;
                  uVar81 = uVar54;
                  uVar77 = uVar52;
                  uVar70 = uVar69;
                  auVar38._0_4_ = uVar14 - 1;
                  auVar38._4_4_ = iVar4 + -1;
                  auVar38._8_4_ = uVar82 - 1;
                  auVar38._12_4_ = iVar67 - 1;
                  auVar39._4_4_ = iVar4;
                  auVar39._0_4_ = iVar4;
                  auVar39._8_4_ = iVar67;
                  auVar39._12_4_ = iVar67;
                  uVar69 = (int)(auVar38._0_4_ * uVar14) / 2 + uVar70;
                  uVar52 = (iVar4 * auVar38._4_4_) / 2 + uVar77;
                  uVar54 = (int)((auVar38._8_8_ & 0xffffffff) * (ulong)uVar82) / 2 + uVar81;
                  uVar68 = (int)((auVar39._8_8_ & 0xffffffff) * (ulong)auVar38._12_4_) / 2 + uVar83;
                  uVar14 = uVar14 + 4;
                  iVar4 = iVar4 + 4;
                  uVar82 = uVar82 + 4;
                  iVar67 = iVar67 + 4;
                  iVar11 = iVar72 + -4;
                  iVar15 = iVar72 + (iVar13 + 3U & 0xfffffffc);
                  iVar72 = iVar11;
                } while (iVar15 != 8);
                uVar14 = -iVar11;
                uVar82 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)(uVar14 ^ 0x80000000));
                uVar71 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar14 | 1) ^ 0x80000000));
                uVar78 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar14 | 2) ^ 0x80000000));
                uVar14 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar14 | 3) ^ 0x80000000));
                iVar3 = iVar3 + uVar80 + (int)((uVar80 + iVar12 * 2) * uVar86) / 2 +
                        (~uVar14 & uVar68 | uVar83 & uVar14) + (~uVar71 & uVar52 | uVar77 & uVar71)
                        + (~uVar78 & uVar54 | uVar81 & uVar78) +
                          (~uVar82 & uVar69 | uVar70 & uVar82);
                if (iVar3 < 0) goto LAB_002c247c;
                local_80.tv_sec._4_4_ = iVar3 * 2 + 1;
                sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                if (pSes->nGates <= (int)uVar76) goto LAB_002c24db;
                uVar14 = pSes->nSpecVars;
                iVar3 = uVar14 + uVar73;
                if (iVar3 <= (int)uVar79) goto LAB_002c2562;
                iVar12 = uVar14 + uVar76;
                iVar13 = uVar14 + 1;
                iVar4 = iVar13;
                if (iVar13 < iVar12) {
                  iVar4 = iVar12;
                }
                uVar69 = ~uVar14 + iVar4;
                iVar4 = uVar14 + 1;
                uVar53 = uVar14 + 2;
                iVar67 = uVar14 + 3;
                if (iVar13 < iVar12) {
                  iVar13 = iVar12;
                }
                iVar13 = iVar13 - uVar14;
                iVar72 = 4;
                uVar80 = pSes->nSelectOffset;
                uVar82 = 0;
                uVar52 = 0;
                uVar54 = 0;
                do {
                  uVar81 = uVar54;
                  uVar77 = uVar52;
                  uVar70 = uVar82;
                  uVar68 = uVar80;
                  auVar40._0_4_ = uVar14 - 1;
                  auVar40._4_4_ = iVar4 + -1;
                  auVar40._8_4_ = uVar53 - 1;
                  auVar40._12_4_ = iVar67 - 1;
                  auVar41._4_4_ = iVar4;
                  auVar41._0_4_ = iVar4;
                  auVar41._8_4_ = iVar67;
                  auVar41._12_4_ = iVar67;
                  uVar80 = (int)(auVar40._0_4_ * uVar14) / 2 + uVar68;
                  uVar82 = (iVar4 * auVar40._4_4_) / 2 + uVar70;
                  uVar52 = (int)((auVar40._8_8_ & 0xffffffff) * (ulong)uVar53) / 2 + uVar77;
                  uVar54 = (int)((auVar41._8_8_ & 0xffffffff) * (ulong)auVar40._12_4_) / 2 + uVar81;
                  uVar14 = uVar14 + 4;
                  iVar4 = iVar4 + 4;
                  uVar53 = uVar53 + 4;
                  iVar67 = iVar67 + 4;
                  iVar11 = iVar72 + -4;
                  iVar15 = iVar72 + (iVar13 + 3U & 0xfffffffc);
                  iVar72 = iVar11;
                } while (iVar15 != 8);
                uVar14 = -iVar11;
                uVar53 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)(uVar14 ^ 0x80000000));
                uVar83 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)((uVar14 | 1) ^ 0x80000000));
                uVar71 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)((uVar14 | 2) ^ 0x80000000));
                uVar14 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)((uVar14 | 3) ^ 0x80000000));
                iVar3 = iVar3 + ~uVar79 + (int)((~uVar79 + iVar12 * 2) * uVar79) / 2 +
                        (~uVar14 & uVar54 | uVar81 & uVar14) + (~uVar83 & uVar82 | uVar70 & uVar83)
                        + (~uVar71 & uVar52 | uVar77 & uVar71) +
                          (~uVar53 & uVar80 | uVar68 & uVar53);
                if (iVar3 < 0) goto LAB_002c247c;
                local_80.tv_sec._4_4_ = iVar3 * 2 + 1;
                sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                uVar86 = uVar86 + 1;
              } while (uVar86 != uVar79);
              uVar79 = uVar79 + 1;
              iVar4 = pSes->nSpecVars;
            } while ((int)uVar79 < (int)(iVar4 + uVar73));
            iVar3 = pSes->nGates;
            iVar13 = (uint)local_68;
          }
          uVar76 = uVar76 + 1;
        } while ((int)uVar76 < iVar3);
      }
      uVar73 = (uint)local_70;
    } while ((int)(uint)local_70 < iVar3 + -1);
    if (2 < iVar3) {
      uVar73 = 0;
      do {
        uVar19 = (ulong)uVar73;
        uVar76 = uVar73 + 1;
        local_48 = CONCAT44(local_48._4_4_,uVar76);
        if ((int)uVar76 < iVar3 + -1) {
          iVar4 = 1 - uVar73;
          local_70 = (ulong)~uVar73;
          local_38 = CONCAT44(local_38._4_4_,iVar4);
          local_50 = uVar19;
          do {
            local_54 = uVar76 + 1;
            if ((int)local_54 < iVar3) {
              local_60 = CONCAT44(local_60._4_4_,(int)local_70 + uVar76);
              iVar13 = pSes->nSpecVars;
              uVar73 = local_54;
              do {
                if (iVar4 < iVar13) {
                  pVVar6 = (Vec_Int_t *)0x1;
                  do {
                    uVar79 = 0;
                    uVar21 = uVar19;
                    local_68 = pVVar6;
                    do {
                      uVar19 = local_50;
                      iVar3 = pSes->nGates;
                      iVar4 = (int)uVar21;
                      if (iVar3 <= iVar4) goto LAB_002c24db;
                      uVar86 = pSes->nSpecVars;
                      iVar13 = uVar86 + iVar4;
                      iVar12 = (int)local_68;
                      if (iVar13 <= iVar12) goto LAB_002c253c;
                      uVar14 = pSes->nSelectOffset;
                      uVar53 = ~uVar86;
                      uVar69 = uVar14;
                      if (iVar4 != 0) {
                        iVar67 = uVar86 + 1;
                        iVar4 = iVar67;
                        if (iVar67 < iVar13) {
                          iVar4 = iVar13;
                        }
                        uVar69 = iVar4 + uVar53;
                        iVar4 = uVar86 + 1;
                        uVar80 = uVar86 + 2;
                        iVar72 = uVar86 + 3;
                        if (iVar67 < iVar13) {
                          iVar67 = iVar13;
                        }
                        iVar11 = 4;
                        uVar82 = uVar14;
                        uVar52 = 0;
                        uVar54 = 0;
                        uVar68 = 0;
                        uVar70 = uVar86;
                        do {
                          uVar71 = uVar68;
                          uVar83 = uVar54;
                          uVar81 = uVar52;
                          uVar77 = uVar82;
                          auVar42._0_4_ = uVar70 - 1;
                          auVar42._4_4_ = iVar4 + -1;
                          auVar42._8_4_ = uVar80 - 1;
                          auVar42._12_4_ = iVar72 - 1;
                          auVar43._4_4_ = iVar4;
                          auVar43._0_4_ = iVar4;
                          auVar43._8_4_ = iVar72;
                          auVar43._12_4_ = iVar72;
                          uVar82 = (int)(auVar42._0_4_ * uVar70) / 2 + uVar77;
                          uVar52 = (iVar4 * auVar42._4_4_) / 2 + uVar81;
                          uVar54 = (int)((auVar42._8_8_ & 0xffffffff) * (ulong)uVar80) / 2 + uVar83;
                          uVar68 = (int)((auVar43._8_8_ & 0xffffffff) * (ulong)auVar42._12_4_) / 2 +
                                   uVar71;
                          uVar70 = uVar70 + 4;
                          iVar4 = iVar4 + 4;
                          uVar80 = uVar80 + 4;
                          iVar72 = iVar72 + 4;
                          iVar15 = iVar11 + -4;
                          iVar87 = iVar11 + ((iVar67 - uVar86) + 3 & 0xfffffffc);
                          iVar11 = iVar15;
                        } while (iVar87 != 8);
                        uVar80 = -iVar15;
                        uVar70 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)(uVar80 ^ 0x80000000));
                        uVar78 = -(uint)((int)(uVar69 ^ 0x80000000) <
                                        (int)((uVar80 | 1) ^ 0x80000000));
                        uVar84 = -(uint)((int)(uVar69 ^ 0x80000000) <
                                        (int)((uVar80 | 2) ^ 0x80000000));
                        uVar69 = -(uint)((int)(uVar69 ^ 0x80000000) <
                                        (int)((uVar80 | 3) ^ 0x80000000));
                        uVar69 = (~uVar69 & uVar68 | uVar71 & uVar69) +
                                 (~uVar78 & uVar52 | uVar81 & uVar78) +
                                 (~uVar84 & uVar54 | uVar83 & uVar84) +
                                 (~uVar70 & uVar82 | uVar77 & uVar70);
                      }
                      uVar80 = ~uVar79;
                      iVar4 = (int)((uVar80 + iVar13 * 2) * uVar79) / 2 + iVar12 + uVar80 + uVar69;
                      if (iVar4 < 0) goto LAB_002c247c;
                      local_80.tv_sec._0_4_ = iVar4 * 2 + 1;
                      if (iVar3 <= (int)uVar76) goto LAB_002c24db;
                      iVar4 = uVar86 + uVar76;
                      if (iVar4 <= iVar12) goto LAB_002c253c;
                      iVar67 = uVar86 + 1;
                      iVar13 = iVar67;
                      if (iVar67 < iVar4) {
                        iVar13 = iVar4;
                      }
                      uVar69 = iVar13 + uVar53;
                      iVar72 = uVar86 + 1;
                      uVar82 = uVar86 + 2;
                      iVar11 = uVar86 + 3;
                      iVar13 = iVar67;
                      if (iVar67 < iVar4) {
                        iVar13 = iVar4;
                      }
                      iVar15 = 4;
                      uVar52 = uVar14;
                      uVar54 = 0;
                      uVar68 = 0;
                      uVar70 = 0;
                      uVar77 = uVar86;
                      do {
                        uVar78 = uVar70;
                        uVar71 = uVar68;
                        uVar83 = uVar54;
                        uVar81 = uVar52;
                        auVar59._0_4_ = uVar77 - 1;
                        auVar59._4_4_ = iVar72 + -1;
                        auVar59._8_4_ = uVar82 - 1;
                        auVar59._12_4_ = iVar11 - 1;
                        auVar60._4_4_ = iVar72;
                        auVar60._0_4_ = iVar72;
                        auVar60._8_4_ = iVar11;
                        auVar60._12_4_ = iVar11;
                        uVar52 = (int)(auVar59._0_4_ * uVar77) / 2 + uVar81;
                        uVar54 = (iVar72 * auVar59._4_4_) / 2 + uVar83;
                        uVar68 = (int)((auVar59._8_8_ & 0xffffffff) * (ulong)uVar82) / 2 + uVar71;
                        uVar70 = (int)((auVar60._8_8_ & 0xffffffff) * (ulong)auVar59._12_4_) / 2 +
                                 uVar78;
                        uVar77 = uVar77 + 4;
                        iVar72 = iVar72 + 4;
                        uVar82 = uVar82 + 4;
                        iVar11 = iVar11 + 4;
                        iVar87 = iVar15 + -4;
                        iVar16 = iVar15 + ((iVar13 - uVar86) + 3 & 0xfffffffc);
                        iVar15 = iVar87;
                      } while (iVar16 != 8);
                      uVar82 = -iVar87;
                      uVar77 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)(uVar82 ^ 0x80000000));
                      uVar84 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)((uVar82 | 1) ^ 0x80000000)
                                      );
                      uVar85 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)((uVar82 | 2) ^ 0x80000000)
                                      );
                      uVar69 = -(uint)((int)(uVar69 ^ 0x80000000) < (int)((uVar82 | 3) ^ 0x80000000)
                                      );
                      iVar4 = (int)((uVar80 + iVar4 * 2) * uVar79) / 2 + iVar12 + uVar80 +
                              (~uVar69 & uVar70 | uVar78 & uVar69) +
                              (~uVar84 & uVar54 | uVar83 & uVar84) +
                              (~uVar85 & uVar68 | uVar71 & uVar85) +
                              (~uVar77 & uVar52 | uVar81 & uVar77);
                      if (iVar4 < 0) goto LAB_002c247c;
                      local_80.tv_sec._4_4_ = iVar4 * 2 + 1;
                      if (iVar3 <= (int)uVar73) goto LAB_002c24db;
                      iVar3 = uVar86 + uVar73;
                      if (iVar3 <= (int)uVar76) goto LAB_002c253c;
                      uVar69 = (uint)local_50;
                      if (uVar76 <= uVar69) goto LAB_002c2562;
                      iVar4 = iVar67;
                      if (iVar67 < iVar3) {
                        iVar4 = iVar3;
                      }
                      uVar53 = uVar53 + iVar4;
                      iVar4 = uVar86 + 1;
                      uVar80 = uVar86 + 2;
                      iVar13 = uVar86 + 3;
                      if (iVar67 < iVar3) {
                        iVar67 = iVar3;
                      }
                      iVar67 = iVar67 - uVar86;
                      iVar12 = 4;
                      uVar82 = 0;
                      uVar52 = 0;
                      uVar54 = 0;
                      do {
                        uVar81 = uVar54;
                        uVar77 = uVar52;
                        uVar70 = uVar82;
                        uVar68 = uVar14;
                        auVar61._0_4_ = uVar86 - 1;
                        auVar61._4_4_ = iVar4 + -1;
                        auVar61._8_4_ = uVar80 - 1;
                        auVar61._12_4_ = iVar13 - 1;
                        auVar62._4_4_ = iVar4;
                        auVar62._0_4_ = iVar4;
                        auVar62._8_4_ = iVar13;
                        auVar62._12_4_ = iVar13;
                        uVar14 = (int)(auVar61._0_4_ * uVar86) / 2 + uVar68;
                        uVar82 = (iVar4 * auVar61._4_4_) / 2 + uVar70;
                        uVar52 = (int)((auVar61._8_8_ & 0xffffffff) * (ulong)uVar80) / 2 + uVar77;
                        uVar54 = (int)((auVar62._8_8_ & 0xffffffff) * (ulong)auVar61._12_4_) / 2 +
                                 uVar81;
                        uVar86 = uVar86 + 4;
                        iVar4 = iVar4 + 4;
                        uVar80 = uVar80 + 4;
                        iVar13 = iVar13 + 4;
                        iVar72 = iVar12 + -4;
                        iVar11 = iVar12 + (iVar67 + 3U & 0xfffffffc);
                        iVar12 = iVar72;
                      } while (iVar11 != 8);
                      uVar86 = -iVar72;
                      uVar80 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)(uVar86 ^ 0x80000000));
                      uVar83 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar86 | 1) ^ 0x80000000)
                                      );
                      uVar71 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar86 | 2) ^ 0x80000000)
                                      );
                      uVar86 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar86 | 3) ^ 0x80000000)
                                      );
                      iVar3 = (int)(((int)local_70 + iVar3 * 2) * uVar69) / 2 + (int)local_60 +
                              (~uVar86 & uVar54 | uVar81 & uVar86) +
                              (~uVar83 & uVar82 | uVar70 & uVar83) +
                              (~uVar71 & uVar52 | uVar77 & uVar71) +
                              (~uVar80 & uVar14 | uVar68 & uVar80);
                      if (iVar3 < 0) goto LAB_002c247c;
                      local_80.tv_nsec._0_4_ = iVar3 * 2 + 1;
                      sat_solver_addclause
                                (pSes->pSat,(lit *)&local_80,(lit *)((long)&local_80.tv_nsec + 4));
                      uVar79 = uVar79 + 1;
                      uVar21 = uVar19;
                    } while (uVar79 != (uint)local_68);
                    uVar79 = (uint)local_68 + 1;
                    pVVar6 = (Vec_Int_t *)(ulong)uVar79;
                    iVar13 = pSes->nSpecVars;
                  } while ((int)uVar79 < (int)(iVar13 + uVar69));
                  iVar3 = pSes->nGates;
                  iVar4 = (int)local_38;
                }
                uVar73 = uVar73 + 1;
              } while ((int)uVar73 < iVar3);
            }
            uVar76 = local_54;
          } while ((int)local_54 < iVar3 + -1);
        }
        uVar73 = (uint)local_48;
      } while ((int)(uint)local_48 < iVar3 + -2);
    }
    if (1 < iVar3) {
      iVar4 = pSes->nSpecVars;
      iVar13 = 0;
      do {
        if (iVar13 + iVar4 < 3) {
          iVar13 = iVar13 + 1;
        }
        else {
          local_60 = (ulong)(iVar13 + 1);
          pVVar6 = (Vec_Int_t *)0x2;
          do {
            uVar19 = local_60;
            uVar73 = 1;
            local_68 = pVVar6;
            do {
              local_70 = CONCAT44(local_70._4_4_,(int)local_68 + ~uVar73);
              uVar76 = 0;
              do {
                if (pSes->nGates <= iVar13) goto LAB_002c24db;
                iVar3 = pSes->nSpecVars;
                iVar4 = iVar3 + iVar13;
                if (iVar4 <= (int)local_68) goto LAB_002c253c;
                uVar79 = pSes->nSelectOffset;
                uVar86 = uVar79;
                if (iVar13 != 0) {
                  iVar12 = iVar3 + 1;
                  if (iVar3 + 1 < iVar4) {
                    iVar12 = iVar4;
                  }
                  uVar80 = (iVar12 - iVar3) - 1;
                  iVar11 = iVar3 + 1;
                  uVar82 = iVar3 + 2;
                  iVar15 = iVar3 + 3;
                  iVar67 = 4;
                  uVar14 = 0;
                  uVar69 = 0;
                  uVar53 = 0;
                  iVar72 = iVar3;
                  do {
                    uVar70 = uVar53;
                    uVar68 = uVar69;
                    uVar54 = uVar14;
                    uVar52 = uVar86;
                    auVar44._0_4_ = iVar72 + -1;
                    auVar44._4_4_ = iVar11 + -1;
                    auVar44._8_4_ = uVar82 - 1;
                    auVar44._12_4_ = iVar15 - 1;
                    auVar45._4_4_ = iVar11;
                    auVar45._0_4_ = iVar11;
                    auVar45._8_4_ = iVar15;
                    auVar45._12_4_ = iVar15;
                    uVar86 = (auVar44._0_4_ * iVar72) / 2 + uVar52;
                    uVar14 = (iVar11 * auVar44._4_4_) / 2 + uVar54;
                    uVar69 = (int)((auVar44._8_8_ & 0xffffffff) * (ulong)uVar82) / 2 + uVar68;
                    uVar53 = (int)((auVar45._8_8_ & 0xffffffff) * (ulong)auVar44._12_4_) / 2 +
                             uVar70;
                    iVar72 = iVar72 + 4;
                    iVar11 = iVar11 + 4;
                    uVar82 = uVar82 + 4;
                    iVar15 = iVar15 + 4;
                    iVar87 = iVar67 + -4;
                    iVar16 = iVar67 + ((iVar12 - iVar3) + 3U & 0xfffffffc);
                    iVar67 = iVar87;
                  } while (iVar16 != 8);
                  uVar82 = -iVar87;
                  uVar77 = -(uint)((int)(uVar80 ^ 0x80000000) < (int)(uVar82 ^ 0x80000000));
                  uVar81 = -(uint)((int)(uVar80 ^ 0x80000000) < (int)((uVar82 | 1) ^ 0x80000000));
                  uVar83 = -(uint)((int)(uVar80 ^ 0x80000000) < (int)((uVar82 | 2) ^ 0x80000000));
                  uVar80 = -(uint)((int)(uVar80 ^ 0x80000000) < (int)((uVar82 | 3) ^ 0x80000000));
                  uVar86 = (~uVar80 & uVar53 | uVar70 & uVar80) +
                           (~uVar81 & uVar14 | uVar54 & uVar81) +
                           (~uVar83 & uVar69 | uVar68 & uVar83) +
                           (~uVar77 & uVar86 | uVar52 & uVar77);
                }
                iVar4 = (int)((~uVar73 + iVar4 * 2) * uVar73) / 2 + (uint)local_70 + uVar86;
                if (iVar4 < 0) goto LAB_002c247c;
                local_80.tv_sec._0_4_ = iVar4 * 2 + 1;
                if (pSes->nGates <= (int)uVar19) goto LAB_002c24db;
                iVar12 = iVar3 + (int)uVar19;
                iVar4 = iVar3 + 1;
                if (iVar3 + 1 < iVar12) {
                  iVar4 = iVar12;
                }
                iVar4 = iVar4 - iVar3;
                uVar53 = iVar4 - 1;
                iVar72 = iVar3 + 1;
                uVar80 = iVar3 + 2;
                iVar11 = iVar3 + 3;
                iVar67 = 4;
                uVar86 = 0;
                uVar14 = 0;
                uVar69 = 0;
                do {
                  uVar68 = uVar69;
                  uVar54 = uVar14;
                  uVar52 = uVar86;
                  uVar82 = uVar79;
                  auVar63._0_4_ = iVar3 + -1;
                  auVar63._4_4_ = iVar72 + -1;
                  auVar63._8_4_ = uVar80 - 1;
                  auVar63._12_4_ = iVar11 - 1;
                  auVar64._4_4_ = iVar72;
                  auVar64._0_4_ = iVar72;
                  auVar64._8_4_ = iVar11;
                  auVar64._12_4_ = iVar11;
                  uVar79 = (auVar63._0_4_ * iVar3) / 2 + uVar82;
                  uVar86 = (iVar72 * auVar63._4_4_) / 2 + uVar52;
                  uVar14 = (int)((auVar63._8_8_ & 0xffffffff) * (ulong)uVar80) / 2 + uVar54;
                  uVar69 = (int)((auVar64._8_8_ & 0xffffffff) * (ulong)auVar63._12_4_) / 2 + uVar68;
                  iVar3 = iVar3 + 4;
                  iVar72 = iVar72 + 4;
                  uVar80 = uVar80 + 4;
                  iVar11 = iVar11 + 4;
                  iVar15 = iVar67 + -4;
                  iVar87 = iVar67 + (iVar4 + 3U & 0xfffffffc);
                  iVar67 = iVar15;
                } while (iVar87 != 8);
                uVar80 = -iVar15;
                uVar70 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)(uVar80 ^ 0x80000000));
                uVar77 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar80 | 1) ^ 0x80000000));
                uVar81 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar80 | 2) ^ 0x80000000));
                uVar53 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)((uVar80 | 3) ^ 0x80000000));
                iVar3 = ~uVar76 + (int)local_68 + (int)((~uVar76 + iVar12 * 2) * uVar76) / 2 +
                        (~uVar53 & uVar69 | uVar68 & uVar53) + (~uVar77 & uVar86 | uVar52 & uVar77)
                        + (~uVar81 & uVar14 | uVar54 & uVar81) +
                          (~uVar70 & uVar79 | uVar82 & uVar70);
                if (iVar3 < 0) goto LAB_002c247c;
                local_80.tv_sec._4_4_ = iVar3 * 2 + 1;
                sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                uVar76 = uVar76 + 1;
              } while (uVar76 != uVar73);
              uVar73 = uVar73 + 1;
            } while (uVar73 != (uint)local_68);
            uVar73 = 0;
            do {
              local_70 = CONCAT44(local_70._4_4_,~uVar73 + (int)local_68);
              uVar76 = 1;
              do {
                uVar79 = 0;
                do {
                  if (pSes->nGates <= iVar13) goto LAB_002c24db;
                  iVar3 = pSes->nSpecVars;
                  iVar4 = iVar3 + iVar13;
                  if (iVar4 <= (int)local_68) goto LAB_002c253c;
                  uVar86 = pSes->nSelectOffset;
                  uVar14 = uVar86;
                  if (iVar13 != 0) {
                    iVar12 = iVar3 + 1;
                    if (iVar3 + 1 < iVar4) {
                      iVar12 = iVar4;
                    }
                    uVar82 = (iVar12 - iVar3) - 1;
                    iVar11 = iVar3 + 1;
                    uVar52 = iVar3 + 2;
                    iVar15 = iVar3 + 3;
                    iVar67 = 4;
                    uVar69 = 0;
                    uVar53 = 0;
                    uVar80 = 0;
                    iVar72 = iVar3;
                    do {
                      uVar77 = uVar80;
                      uVar70 = uVar53;
                      uVar68 = uVar69;
                      uVar54 = uVar14;
                      auVar46._0_4_ = iVar72 + -1;
                      auVar46._4_4_ = iVar11 + -1;
                      auVar46._8_4_ = uVar52 - 1;
                      auVar46._12_4_ = iVar15 - 1;
                      auVar47._4_4_ = iVar11;
                      auVar47._0_4_ = iVar11;
                      auVar47._8_4_ = iVar15;
                      auVar47._12_4_ = iVar15;
                      uVar14 = (auVar46._0_4_ * iVar72) / 2 + uVar54;
                      uVar69 = (iVar11 * auVar46._4_4_) / 2 + uVar68;
                      uVar53 = (int)((auVar46._8_8_ & 0xffffffff) * (ulong)uVar52) / 2 + uVar70;
                      uVar80 = (int)((auVar47._8_8_ & 0xffffffff) * (ulong)auVar46._12_4_) / 2 +
                               uVar77;
                      iVar72 = iVar72 + 4;
                      iVar11 = iVar11 + 4;
                      uVar52 = uVar52 + 4;
                      iVar15 = iVar15 + 4;
                      iVar87 = iVar67 + -4;
                      iVar16 = iVar67 + ((iVar12 - iVar3) + 3U & 0xfffffffc);
                      iVar67 = iVar87;
                    } while (iVar16 != 8);
                    uVar52 = -iVar87;
                    uVar81 = -(uint)((int)(uVar82 ^ 0x80000000) < (int)(uVar52 ^ 0x80000000));
                    uVar83 = -(uint)((int)(uVar82 ^ 0x80000000) < (int)((uVar52 | 1) ^ 0x80000000));
                    uVar71 = -(uint)((int)(uVar82 ^ 0x80000000) < (int)((uVar52 | 2) ^ 0x80000000));
                    uVar82 = -(uint)((int)(uVar82 ^ 0x80000000) < (int)((uVar52 | 3) ^ 0x80000000));
                    uVar14 = (~uVar82 & uVar80 | uVar77 & uVar82) +
                             (~uVar83 & uVar69 | uVar68 & uVar83) +
                             (~uVar71 & uVar53 | uVar70 & uVar71) +
                             (~uVar81 & uVar14 | uVar54 & uVar81);
                  }
                  iVar4 = (int)((~uVar73 + iVar4 * 2) * uVar73) / 2 + (uint)local_70 + uVar14;
                  if (iVar4 < 0) goto LAB_002c247c;
                  local_80.tv_sec._0_4_ = iVar4 * 2 + 1;
                  if (pSes->nGates <= (int)local_60) goto LAB_002c24db;
                  iVar12 = iVar3 + (int)local_60;
                  iVar4 = iVar3 + 1;
                  if (iVar3 + 1 < iVar12) {
                    iVar4 = iVar12;
                  }
                  iVar4 = iVar4 - iVar3;
                  uVar80 = iVar4 - 1;
                  iVar72 = iVar3 + 1;
                  uVar82 = iVar3 + 2;
                  iVar11 = iVar3 + 3;
                  iVar67 = 4;
                  uVar14 = 0;
                  uVar69 = 0;
                  uVar53 = 0;
                  do {
                    uVar70 = uVar53;
                    uVar68 = uVar69;
                    uVar54 = uVar14;
                    uVar52 = uVar86;
                    auVar65._0_4_ = iVar3 + -1;
                    auVar65._4_4_ = iVar72 + -1;
                    auVar65._8_4_ = uVar82 - 1;
                    auVar65._12_4_ = iVar11 - 1;
                    auVar66._4_4_ = iVar72;
                    auVar66._0_4_ = iVar72;
                    auVar66._8_4_ = iVar11;
                    auVar66._12_4_ = iVar11;
                    uVar86 = (auVar65._0_4_ * iVar3) / 2 + uVar52;
                    uVar14 = (iVar72 * auVar65._4_4_) / 2 + uVar54;
                    uVar69 = (int)((auVar65._8_8_ & 0xffffffff) * (ulong)uVar82) / 2 + uVar68;
                    uVar53 = (int)((auVar66._8_8_ & 0xffffffff) * (ulong)auVar65._12_4_) / 2 +
                             uVar70;
                    iVar3 = iVar3 + 4;
                    iVar72 = iVar72 + 4;
                    uVar82 = uVar82 + 4;
                    iVar11 = iVar11 + 4;
                    iVar15 = iVar67 + -4;
                    iVar87 = iVar67 + (iVar4 + 3U & 0xfffffffc);
                    iVar67 = iVar15;
                  } while (iVar87 != 8);
                  uVar82 = -iVar15;
                  uVar77 = -(uint)((int)(uVar80 ^ 0x80000000) < (int)(uVar82 ^ 0x80000000));
                  uVar81 = -(uint)((int)(uVar80 ^ 0x80000000) < (int)((uVar82 | 1) ^ 0x80000000));
                  uVar83 = -(uint)((int)(uVar80 ^ 0x80000000) < (int)((uVar82 | 2) ^ 0x80000000));
                  uVar80 = -(uint)((int)(uVar80 ^ 0x80000000) < (int)((uVar82 | 3) ^ 0x80000000));
                  iVar3 = ~uVar79 + uVar76 + (int)((~uVar79 + iVar12 * 2) * uVar79) / 2 +
                          (~uVar80 & uVar53 | uVar70 & uVar80) +
                          (~uVar81 & uVar14 | uVar54 & uVar81) +
                          (~uVar83 & uVar69 | uVar68 & uVar83) +
                          (~uVar77 & uVar86 | uVar52 & uVar77);
                  if (iVar3 < 0) goto LAB_002c247c;
                  local_80.tv_sec._4_4_ = iVar3 * 2 + 1;
                  sat_solver_addclause(pSes->pSat,(lit *)&local_80,(lit *)&local_80.tv_nsec);
                  uVar79 = uVar79 + 1;
                } while (uVar79 != uVar76);
                uVar76 = uVar76 + 1;
                uVar79 = (uint)local_68;
              } while (uVar76 != uVar79);
              uVar73 = uVar73 + 1;
            } while (uVar73 != uVar79);
            pVVar6 = (Vec_Int_t *)(ulong)(uVar79 + 1);
            iVar4 = pSes->nSpecVars;
          } while ((int)(uVar79 + 1) < iVar4 + iVar13);
          iVar3 = pSes->nGates;
          iVar13 = (int)local_60;
        }
      } while (iVar13 < iVar3 + -1);
    }
  }
  if ((pSes->nSpecFunc == 1) && (1 < pSes->nSpecVars)) {
    uVar19 = 1;
    do {
      uVar21 = 0;
      local_60 = uVar19;
      do {
        iVar3 = Extra_TruthVarsSymm((uint *)pSes->pSpec,pSes->nSpecVars,(int)uVar21,(int)uVar19);
        if ((iVar3 != 0) &&
           ((piVar7 = pSes->pArrTimeProfile, piVar7 == (int *)0x0 ||
            (piVar7[uVar21] <= piVar7[uVar19])))) {
          if (pSes->fSatVerbose != 0) {
            printf("variables %d and %d are symmetric\n",uVar21 & 0xffffffff,uVar19 & 0xffffffff);
          }
          if (0 < pSes->nGates) {
            pVVar6 = (Vec_Int_t *)0x0;
            do {
              uVar10 = 0;
              local_68 = pVVar6;
              do {
                if (uVar21 != uVar10) {
                  pVVar8 = (Vec_Int_t *)calloc(1,0x10);
                  iVar3 = (int)pVVar6;
                  if (pSes->nGates <= iVar3) goto LAB_002c24db;
                  uVar73 = pSes->nSpecVars;
                  iVar4 = uVar73 + iVar3;
                  if ((long)iVar4 <= (long)uVar19) goto LAB_002c253c;
                  uVar76 = pSes->nSelectOffset;
                  if (iVar3 != 0) {
                    iVar12 = uVar73 + 1;
                    iVar13 = iVar12;
                    if (iVar12 < iVar4) {
                      iVar13 = iVar4;
                    }
                    uVar79 = ~uVar73 + iVar13;
                    iVar13 = uVar73 + 1;
                    uVar86 = uVar73 + 2;
                    iVar67 = uVar73 + 3;
                    if (iVar12 < iVar4) {
                      iVar12 = iVar4;
                    }
                    iVar12 = iVar12 - uVar73;
                    iVar72 = 4;
                    uVar14 = 0;
                    uVar69 = 0;
                    uVar53 = 0;
                    do {
                      uVar54 = uVar53;
                      uVar52 = uVar69;
                      uVar82 = uVar14;
                      uVar80 = uVar76;
                      auVar48._0_4_ = uVar73 - 1;
                      auVar48._4_4_ = iVar13 + -1;
                      auVar48._8_4_ = uVar86 - 1;
                      auVar48._12_4_ = iVar67 - 1;
                      auVar49._4_4_ = iVar13;
                      auVar49._0_4_ = iVar13;
                      auVar49._8_4_ = iVar67;
                      auVar49._12_4_ = iVar67;
                      uVar76 = (int)(auVar48._0_4_ * uVar73) / 2 + uVar80;
                      uVar14 = (iVar13 * auVar48._4_4_) / 2 + uVar82;
                      uVar69 = (int)((auVar48._8_8_ & 0xffffffff) * (ulong)uVar86) / 2 + uVar52;
                      uVar53 = (int)((auVar49._8_8_ & 0xffffffff) * (ulong)auVar48._12_4_) / 2 +
                               uVar54;
                      uVar73 = uVar73 + 4;
                      iVar13 = iVar13 + 4;
                      uVar86 = uVar86 + 4;
                      iVar67 = iVar67 + 4;
                      iVar11 = iVar72 + -4;
                      iVar15 = iVar72 + (iVar12 + 3U & 0xfffffffc);
                      iVar72 = iVar11;
                    } while (iVar15 != 8);
                    uVar73 = -iVar11;
                    uVar86 = -(uint)((int)(uVar79 ^ 0x80000000) < (int)(uVar73 ^ 0x80000000));
                    uVar68 = -(uint)((int)(uVar79 ^ 0x80000000) < (int)((uVar73 | 1) ^ 0x80000000));
                    uVar70 = -(uint)((int)(uVar79 ^ 0x80000000) < (int)((uVar73 | 2) ^ 0x80000000));
                    uVar73 = -(uint)((int)(uVar79 ^ 0x80000000) < (int)((uVar73 | 3) ^ 0x80000000));
                    uVar76 = (~uVar73 & uVar53 | uVar54 & uVar73) +
                             (~uVar68 & uVar14 | uVar82 & uVar68) +
                             (~uVar70 & uVar69 | uVar52 & uVar70) +
                             (~uVar86 & uVar76 | uVar80 & uVar86);
                  }
                  uVar73 = ~(uint)uVar10;
                  iVar4 = uVar73 + (int)uVar19 + (int)((uVar73 + iVar4 * 2) * (uint)uVar10) / 2 +
                          uVar76;
                  local_70 = uVar10;
                  if (iVar4 < 0) goto LAB_002c247c;
                  Vec_IntPush(pVVar8,iVar4 * 2 + 1);
                  if (iVar3 != 0) {
                    iVar3 = pSes->nSpecVars;
                    iVar4 = 0;
                    do {
                      if (1 < iVar4 + iVar3) {
                        uVar19 = 1;
                        do {
                          uVar10 = 0;
                          do {
                            if (uVar21 == uVar19 || uVar21 == uVar10) {
                              if (pSes->nGates <= iVar4) goto LAB_002c24db;
                              uVar73 = pSes->nSpecVars;
                              iVar3 = uVar73 + iVar4;
                              if ((long)iVar3 <= (long)uVar19) goto LAB_002c253c;
                              uVar76 = pSes->nSelectOffset;
                              if (iVar4 != 0) {
                                iVar13 = uVar73 + 1;
                                iVar12 = iVar13;
                                if (iVar13 < iVar3) {
                                  iVar12 = iVar3;
                                }
                                uVar79 = ~uVar73 + iVar12;
                                iVar12 = uVar73 + 1;
                                uVar86 = uVar73 + 2;
                                iVar67 = uVar73 + 3;
                                if (iVar13 < iVar3) {
                                  iVar13 = iVar3;
                                }
                                iVar13 = iVar13 - uVar73;
                                iVar72 = 4;
                                uVar14 = 0;
                                uVar69 = 0;
                                uVar53 = 0;
                                do {
                                  uVar54 = uVar53;
                                  uVar52 = uVar69;
                                  uVar82 = uVar14;
                                  uVar80 = uVar76;
                                  auVar50._0_4_ = uVar73 - 1;
                                  auVar50._4_4_ = iVar12 + -1;
                                  auVar50._8_4_ = uVar86 - 1;
                                  auVar50._12_4_ = iVar67 - 1;
                                  auVar51._4_4_ = iVar12;
                                  auVar51._0_4_ = iVar12;
                                  auVar51._8_4_ = iVar67;
                                  auVar51._12_4_ = iVar67;
                                  uVar76 = (int)(auVar50._0_4_ * uVar73) / 2 + uVar80;
                                  uVar14 = (iVar12 * auVar50._4_4_) / 2 + uVar82;
                                  uVar69 = (int)((auVar50._8_8_ & 0xffffffff) * (ulong)uVar86) / 2 +
                                           uVar52;
                                  uVar53 = (int)((auVar51._8_8_ & 0xffffffff) *
                                                (ulong)auVar50._12_4_) / 2 + uVar54;
                                  uVar73 = uVar73 + 4;
                                  iVar12 = iVar12 + 4;
                                  uVar86 = uVar86 + 4;
                                  iVar67 = iVar67 + 4;
                                  iVar11 = iVar72 + -4;
                                  iVar15 = iVar72 + (iVar13 + 3U & 0xfffffffc);
                                  iVar72 = iVar11;
                                } while (iVar15 != 8);
                                uVar73 = -iVar11;
                                uVar86 = -(uint)((int)(uVar79 ^ 0x80000000) <
                                                (int)(uVar73 ^ 0x80000000));
                                uVar68 = -(uint)((int)(uVar79 ^ 0x80000000) <
                                                (int)((uVar73 | 1) ^ 0x80000000));
                                uVar70 = -(uint)((int)(uVar79 ^ 0x80000000) <
                                                (int)((uVar73 | 2) ^ 0x80000000));
                                uVar73 = -(uint)((int)(uVar79 ^ 0x80000000) <
                                                (int)((uVar73 | 3) ^ 0x80000000));
                                uVar76 = (~uVar73 & uVar53 | uVar54 & uVar73) +
                                         (~uVar68 & uVar14 | uVar82 & uVar68) +
                                         (~uVar70 & uVar69 | uVar52 & uVar70) +
                                         (~uVar86 & uVar76 | uVar80 & uVar86);
                              }
                              uVar73 = ~(uint)uVar10;
                              iVar3 = uVar73 + (int)uVar19 +
                                      (int)((uVar73 + iVar3 * 2) * (uint)uVar10) / 2 + uVar76;
                              if (iVar3 < 0) goto LAB_002c247c;
                              Vec_IntPush(pVVar8,iVar3 * 2);
                            }
                            uVar10 = uVar10 + 1;
                          } while (uVar10 != uVar19);
                          uVar19 = uVar19 + 1;
                          iVar3 = pSes->nSpecVars;
                        } while ((long)uVar19 < (long)(iVar3 + iVar4));
                      }
                      iVar4 = iVar4 + 1;
                      pVVar6 = local_68;
                    } while (iVar4 != (int)local_68);
                  }
                  plVar1 = pVVar8->pArray;
                  sat_solver_addclause(pSes->pSat,plVar1,plVar1 + pVVar8->nSize);
                  if (plVar1 != (lit *)0x0) {
                    free(plVar1);
                  }
                  free(pVVar8);
                  uVar10 = local_70;
                  uVar19 = local_60;
                }
                uVar10 = uVar10 + 1;
              } while (uVar19 != uVar10);
              uVar73 = (int)pVVar6 + 1;
              pVVar6 = (Vec_Int_t *)(ulong)uVar73;
            } while ((int)uVar73 < pSes->nGates);
          }
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar19);
      uVar19 = uVar19 + 1;
      bVar2 = false;
    } while ((long)uVar19 < (long)pSes->nSpecVars);
  }
  else {
    bVar2 = false;
  }
LAB_002c249d:
  iVar3 = clock_gettime(3,&local_80);
  if (iVar3 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec) / 1000 +
            CONCAT44(local_80.tv_sec._4_4_,(int)local_80.tv_sec) * 1000000;
  }
  pSes->timeInstance = pSes->timeInstance + lVar9 + local_40;
  if (bVar2) {
    return 2;
  }
  iVar3 = Ses_ManSolve(pSes);
  if (iVar3 == 1) {
    return 1;
  }
  if (iVar3 != 2) {
    return 2;
  }
LAB_002c0058:
  pSes->fHitResLimit = 1;
  return 0;
}

Assistant:

static int Ses_ManFindNetworkExact( Ses_Man_t * pSes, int nGates )
{
    int f, fSat;
    abctime timeStart;

    /* solve */
    timeStart = Abc_Clock();
    Vec_IntClear( pSes->vPolar );
    Vec_IntClear( pSes->vAssump );
    Ses_ManCreateVars( pSes, nGates );

    if ( pSes->nMaxDepth != -1 )
    {
        f = Ses_ManCreateDepthClauses( pSes );
        pSes->timeInstance += ( Abc_Clock() - timeStart );
        if ( !f ) return 2; /* proven UNSAT while creating clauses */
    }

    sat_solver_set_polarity( pSes->pSat, Vec_IntArray( pSes->vPolar ), Vec_IntSize( pSes->vPolar ) );

    /* first solve */
    fSat = Ses_ManSolve( pSes );
    if ( fSat == 0 )
        return 2; /* UNSAT, continue with next # of gates */
    else if ( fSat == 2 )
    {
        pSes->fHitResLimit = 1;
        return 0;
    }

    timeStart = Abc_Clock();
    f = Ses_ManCreateClauses( pSes );
    pSes->timeInstance += ( Abc_Clock() - timeStart );
    if ( !f ) return 2; /* proven UNSAT while creating clauses */

    fSat = Ses_ManSolve( pSes );
    if ( fSat == 1 )
        return 1;
    else if ( fSat == 2 )
    {
        pSes->fHitResLimit = 1;
        return 0;
    }

    return 2; /* UNSAT continue */
}